

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

MPP_RET fill_image(RK_U8 *buf,RK_U32 width,RK_U32 height,RK_U32 hor_stride,RK_U32 ver_stride,
                  MppFrameFormat fmt,RK_U32 frame_count)

{
  FillRgbFunc p_Var1;
  char cVar2;
  char cVar3;
  char cVar4;
  MppFrameFormat MVar5;
  RK_S32 RVar6;
  MPP_RET MVar7;
  ulong uVar8;
  long lVar9;
  RK_U8 *p;
  RK_U8 *pRVar10;
  ulong uVar11;
  RK_U8 RVar12;
  RK_U32 RVar13;
  undefined4 in_register_00000084;
  char *fmt_name;
  RK_U8 RVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  RK_U32 RVar18;
  RK_U8 *pRVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar37;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar113;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar114;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar115;
  int iVar178;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  int iVar368;
  undefined1 in_XMM7 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  RK_U32 B;
  RK_U32 G;
  RK_U32 R;
  RK_U32 local_5c;
  RK_U32 local_58;
  RK_U32 local_54;
  ulong local_50;
  undefined1 local_48 [16];
  
  local_48._8_8_ = local_48._0_8_;
  auVar41 = _DAT_00118290;
  auVar35 = _DAT_00118280;
  fmt_name = (char *)CONCAT44(in_register_00000084,ver_stride);
  MVar5 = fmt & 0xfffff;
  uVar15 = MVar5 - MPP_FMT_RGB565;
  if (uVar15 < 0xe) {
    if ((0x3fU >> (uVar15 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar15 & 0x1f) & 1) == 0) {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar6 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,3);
        if (RVar6 != 0) {
          hor_stride = hor_stride * 3;
          fill_image_is_pixel_stride = 1;
        }
        RVar6 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,hor_stride,3,0x11844c,fmt_name);
        if (RVar6 != 0) {
          hor_stride = ((hor_stride + 0x17) / 0x18) * 0x18;
          fill_image_not_8_pixel = 1;
        }
        if (height != 0) {
          local_48._0_8_ = p_Var1;
          local_50 = CONCAT44(local_50._4_4_,(uint)((fmt >> 0x18 & 1) == 0));
          RVar13 = 0;
          do {
            if (width != 0) {
              RVar18 = 0;
              uVar8 = 0;
              do {
                get_rgb_color(&local_54,&local_58,&local_5c,RVar18,RVar13,frame_count);
                (*(code *)local_48._0_8_)
                          (buf + uVar8,local_54,local_58,local_5c,local_50 & 0xffffffff);
                RVar18 = RVar18 + 1;
                uVar8 = (ulong)((int)uVar8 + 3);
              } while (width != RVar18);
            }
            RVar13 = RVar13 + 1;
            buf = buf + hor_stride;
          } while (RVar13 != height);
        }
      }
      else {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar6 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,4);
        if (RVar6 != 0) {
          hor_stride = hor_stride << 2;
          fill_image_is_pixel_stride = 1;
        }
        RVar6 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,hor_stride,4,0x118442,fmt_name);
        if (RVar6 != 0) {
          hor_stride = hor_stride + 0x1f & 0xffffffe0;
          fill_image_not_8_pixel = 1;
        }
        if (height != 0) {
          local_48._0_8_ = p_Var1;
          local_50 = CONCAT44(local_50._4_4_,(uint)((fmt >> 0x18 & 1) == 0));
          RVar13 = 0;
          do {
            if (width != 0) {
              RVar18 = 0;
              uVar8 = 0;
              do {
                get_rgb_color(&local_54,&local_58,&local_5c,RVar18,RVar13,frame_count);
                (*(code *)local_48._0_8_)
                          (buf + uVar8,local_54,local_58,local_5c,local_50 & 0xffffffff);
                RVar18 = RVar18 + 1;
                uVar8 = (ulong)((int)uVar8 + 4);
              } while (width != RVar18);
            }
            RVar13 = RVar13 + 1;
            buf = buf + hor_stride;
          } while (RVar13 != height);
        }
      }
    }
    else {
      p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      RVar6 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,2);
      if (RVar6 != 0) {
        hor_stride = hor_stride * 2;
        fill_image_is_pixel_stride = 1;
      }
      RVar6 = util_check_8_pixel_aligned
                        ((uint)fill_image_not_8_pixel,hor_stride,2,0x118438,fmt_name);
      if (RVar6 != 0) {
        hor_stride = hor_stride + 0xf & 0xfffffff0;
        fill_image_not_8_pixel = 1;
      }
      if (height != 0) {
        local_48._0_8_ = p_Var1;
        local_50 = CONCAT44(local_50._4_4_,(uint)((fmt >> 0x18 & 1) == 0));
        RVar13 = 0;
        do {
          if (width != 0) {
            RVar18 = 0;
            uVar8 = 0;
            do {
              get_rgb_color(&local_54,&local_58,&local_5c,RVar18,RVar13,frame_count);
              (*(code *)local_48._0_8_)
                        (buf + uVar8,local_54,local_58,local_5c,local_50 & 0xffffffff);
              RVar18 = RVar18 + 1;
              uVar8 = (ulong)((int)uVar8 + 2);
            } while (width != RVar18);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
        } while (RVar13 != height);
      }
    }
    goto LAB_001131c9;
  }
  if (MVar5 < MPP_FMT_YUV444SP_10BIT) {
    uVar15 = ver_stride * hor_stride;
    pRVar19 = buf + uVar15;
    cVar4 = (char)frame_count;
    switch(MVar5) {
    case MPP_FMT_YUV420SP:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar20._8_4_ = (int)lVar9;
        auVar20._0_8_ = lVar9;
        auVar20._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar393._8_4_ = 0xffffffff;
        auVar393._0_8_ = 0xffffffffffffffff;
        auVar393._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar38 = _DAT_00118210;
            auVar52 = _DAT_00118220;
            auVar87 = _DAT_00118230;
            auVar116 = _DAT_00118240;
            auVar409 = _DAT_00118280;
            auVar420 = _DAT_00118270;
            auVar432 = _DAT_00118260;
            auVar444 = _DAT_00118250;
            do {
              auVar35 = auVar20 ^ auVar41;
              auVar63 = auVar409 ^ auVar41;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar35._4_4_;
              auVar231._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar35._12_4_;
              auVar231._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar320._4_4_ = iVar115;
              auVar320._0_4_ = iVar115;
              auVar320._8_4_ = iVar178;
              auVar320._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM5,auVar320,0xe8);
              auVar230._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar230._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar230._0_4_ = auVar230._4_4_;
              auVar230._8_4_ = auVar230._12_4_;
              auVar243 = pshuflw(in_XMM11,auVar230,0xe8);
              auVar231._0_4_ = auVar231._4_4_;
              auVar231._8_4_ = auVar231._12_4_;
              auVar63 = pshuflw(auVar35,auVar231,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar35) ^ auVar393;
              auVar63 = packssdw(auVar63,auVar63);
              cVar2 = (char)uVar15;
              cVar3 = (char)uVar8;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar231 = auVar230 & auVar320 | auVar231;
              auVar63 = packssdw(auVar231,auVar231);
              auVar63 = packssdw(auVar63 ^ auVar393,auVar63 ^ auVar393);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar63 = auVar420 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar369._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar369._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar232._4_4_ = iVar115;
              auVar232._0_4_ = iVar115;
              auVar232._8_4_ = iVar178;
              auVar232._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar321._4_4_ = iVar115;
              auVar321._0_4_ = iVar115;
              auVar321._8_4_ = iVar178;
              auVar321._12_4_ = iVar178;
              auVar369._0_4_ = auVar369._4_4_;
              auVar369._8_4_ = auVar369._12_4_;
              auVar63 = auVar321 & auVar232 | auVar369;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar393,auVar63 ^ auVar393);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar63 = pshufhw(auVar63,auVar232,0x84);
              auVar68 = pshufhw(auVar232,auVar321,0x84);
              auVar67 = pshufhw(auVar63,auVar369,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar393;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar63 = auVar432 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar234._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar234._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar322._4_4_ = iVar115;
              auVar322._0_4_ = iVar115;
              auVar322._8_4_ = iVar178;
              auVar322._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243 & auVar35,auVar322,0xe8);
              auVar179._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar179._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar179._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar179._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar233._4_4_ = auVar179._4_4_;
              auVar233._0_4_ = auVar179._4_4_;
              auVar233._8_4_ = auVar179._12_4_;
              auVar233._12_4_ = auVar179._12_4_;
              auVar35 = pshuflw(auVar179,auVar233,0xe8);
              auVar234._0_4_ = auVar234._4_4_;
              auVar234._8_4_ = auVar234._12_4_;
              auVar63 = pshuflw(auVar243,auVar234,0xe8);
              auVar63 = (auVar63 | auVar35 & auVar243) ^ auVar393;
              auVar35 = packssdw(auVar35 & auVar243,auVar63);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar234 = auVar233 & auVar322 | auVar234;
              auVar243 = packssdw(auVar234,auVar234);
              auVar35 = packssdw(auVar35,auVar243 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar444 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar370._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar370._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar235._4_4_ = iVar115;
              auVar235._0_4_ = iVar115;
              auVar235._8_4_ = iVar178;
              auVar235._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar323._4_4_ = iVar115;
              auVar323._0_4_ = iVar115;
              auVar323._8_4_ = iVar178;
              auVar323._12_4_ = iVar178;
              auVar370._0_4_ = auVar370._4_4_;
              auVar370._8_4_ = auVar370._12_4_;
              auVar35 = auVar323 & auVar235 | auVar370;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar393,auVar35 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar35 = pshufhw(auVar35,auVar235,0x84);
              auVar67 = pshufhw(auVar235,auVar323,0x84);
              auVar243 = pshufhw(auVar35,auVar370,0x84);
              auVar35 = (auVar243 | auVar67 & auVar35) ^ auVar393;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar35 = auVar116 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar237._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar237._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar324._4_4_ = iVar115;
              auVar324._0_4_ = iVar115;
              auVar324._8_4_ = iVar178;
              auVar324._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar324,0xe8);
              auVar180._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar180._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar180._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar180._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar236._4_4_ = auVar180._4_4_;
              auVar236._0_4_ = auVar180._4_4_;
              auVar236._8_4_ = auVar180._12_4_;
              auVar236._12_4_ = auVar180._12_4_;
              auVar35 = pshuflw(auVar180,auVar236,0xe8);
              auVar237._0_4_ = auVar237._4_4_;
              auVar237._8_4_ = auVar237._12_4_;
              auVar243 = pshuflw(auVar63,auVar237,0xe8);
              auVar243 = (auVar243 | auVar35 & auVar63) ^ auVar393;
              auVar243 = packssdw(auVar243,auVar243);
              auVar35 = packsswb(auVar35 & auVar63,auVar243);
              if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar237 = auVar236 & auVar324 | auVar237;
              auVar63 = packssdw(auVar237,auVar237);
              auVar63 = packssdw(auVar63 ^ auVar393,auVar63 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar63);
              if ((auVar35._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar35 = auVar87 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar371._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar371._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar238._4_4_ = iVar115;
              auVar238._0_4_ = iVar115;
              auVar238._8_4_ = iVar178;
              auVar238._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar325._4_4_ = iVar115;
              auVar325._0_4_ = iVar115;
              auVar325._8_4_ = iVar178;
              auVar325._12_4_ = iVar178;
              auVar371._0_4_ = auVar371._4_4_;
              auVar371._8_4_ = auVar371._12_4_;
              auVar35 = auVar325 & auVar238 | auVar371;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar393,auVar35 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar35 = pshufhw(auVar35,auVar238,0x84);
              auVar67 = pshufhw(auVar238,auVar325,0x84);
              auVar63 = pshufhw(auVar35,auVar371,0x84);
              auVar35 = (auVar63 | auVar67 & auVar35) ^ auVar393;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar35 = auVar52 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar240._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar240._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar326._4_4_ = iVar115;
              auVar326._0_4_ = iVar115;
              auVar326._8_4_ = iVar178;
              auVar326._12_4_ = iVar178;
              auVar63 = pshuflw(auVar243,auVar326,0xe8);
              auVar181._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar181._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar181._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar181._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar239._4_4_ = auVar181._4_4_;
              auVar239._0_4_ = auVar181._4_4_;
              auVar239._8_4_ = auVar181._12_4_;
              auVar239._12_4_ = auVar181._12_4_;
              auVar35 = pshuflw(auVar181,auVar239,0xe8);
              auVar240._0_4_ = auVar240._4_4_;
              auVar240._8_4_ = auVar240._12_4_;
              auVar243 = pshuflw(auVar63,auVar240,0xe8);
              in_XMM11 = (auVar243 | auVar35 & auVar63) ^ auVar393;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM11);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar240 = auVar239 & auVar326 | auVar240;
              auVar63 = packssdw(auVar240,auVar240);
              auVar35 = packssdw(auVar35,auVar63 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar38 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar35._0_4_);
              auVar327._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar368 = -(uint)(iVar368 < auVar35._8_4_);
              auVar327._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar241._4_4_ = iVar113;
              auVar241._0_4_ = iVar113;
              auVar241._8_4_ = iVar368;
              auVar241._12_4_ = iVar368;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar21._4_4_ = iVar113;
              auVar21._0_4_ = iVar113;
              auVar21._8_4_ = iVar114;
              auVar21._12_4_ = iVar114;
              auVar327._0_4_ = auVar327._4_4_;
              auVar327._8_4_ = auVar327._12_4_;
              auVar35 = auVar21 & auVar241 | auVar327;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar393,auVar35 ^ auVar393);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar63 = pshufhw(auVar35,auVar241,0x84);
              auVar35 = pshufhw(auVar21,auVar21,0x84);
              auVar243 = pshufhw(auVar63,auVar327,0x84);
              in_XMM5 = (auVar243 | auVar35 & auVar63) ^ auVar393;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM5);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar409._8_8_;
              auVar409._0_8_ = auVar409._0_8_ + 0x10;
              auVar409._8_8_ = lVar9 + 0x10;
              lVar9 = auVar420._8_8_;
              auVar420._0_8_ = auVar420._0_8_ + 0x10;
              auVar420._8_8_ = lVar9 + 0x10;
              lVar9 = auVar432._8_8_;
              auVar432._0_8_ = auVar432._0_8_ + 0x10;
              auVar432._8_8_ = lVar9 + 0x10;
              lVar9 = auVar444._8_8_;
              auVar444._0_8_ = auVar444._0_8_ + 0x10;
              auVar444._8_8_ = lVar9 + 0x10;
              lVar9 = auVar116._8_8_;
              auVar116._0_8_ = auVar116._0_8_ + 0x10;
              auVar116._8_8_ = lVar9 + 0x10;
              lVar9 = auVar87._8_8_;
              auVar87._0_8_ = auVar87._0_8_ + 0x10;
              auVar87._8_8_ = lVar9 + 0x10;
              lVar9 = auVar52._8_8_;
              auVar52._0_8_ = auVar52._0_8_ + 0x10;
              auVar52._8_8_ = lVar9 + 0x10;
              lVar9 = auVar38._8_8_;
              auVar38._0_8_ = auVar38._0_8_ + 0x10;
              auVar38._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        if (height != 1) {
          uVar15 = 0;
          do {
            if (1 < width) {
              uVar8 = 0;
              do {
                pRVar19[uVar8 * 2] = ((byte)uVar15 ^ 0x80) + cVar4 * '\x02';
                pRVar19[uVar8 * 2 + 1] = cVar4 * '\x05' + '@' + (char)uVar8;
                uVar8 = uVar8 + 1;
              } while (width >> 1 != uVar8);
            }
            uVar15 = uVar15 + 1;
            pRVar19 = pRVar19 + hor_stride;
          } while (uVar15 != height >> 1);
          return MPP_OK;
        }
      }
      break;
    default:
      goto switchD_0010e474_caseD_1;
    case MPP_FMT_YUV422SP:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar30._8_4_ = (int)lVar9;
        auVar30._0_8_ = lVar9;
        auVar30._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar401._8_4_ = 0xffffffff;
        auVar401._0_8_ = 0xffffffffffffffff;
        auVar401._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar49 = _DAT_00118210;
            auVar84 = _DAT_00118220;
            auVar110 = _DAT_00118230;
            auVar175 = _DAT_00118240;
            auVar417 = _DAT_00118280;
            auVar429 = _DAT_00118270;
            auVar441 = _DAT_00118260;
            auVar453 = _DAT_00118250;
            do {
              auVar35 = auVar30 ^ auVar41;
              auVar63 = auVar417 ^ auVar41;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar35._4_4_;
              auVar285._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar35._12_4_;
              auVar285._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar344._4_4_ = iVar115;
              auVar344._0_4_ = iVar115;
              auVar344._8_4_ = iVar178;
              auVar344._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM5,auVar344,0xe8);
              auVar284._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar284._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar284._0_4_ = auVar284._4_4_;
              auVar284._8_4_ = auVar284._12_4_;
              auVar243 = pshuflw(in_XMM11,auVar284,0xe8);
              auVar285._0_4_ = auVar285._4_4_;
              auVar285._8_4_ = auVar285._12_4_;
              auVar63 = pshuflw(auVar35,auVar285,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar35) ^ auVar401;
              auVar63 = packssdw(auVar63,auVar63);
              cVar2 = (char)uVar15;
              cVar3 = (char)uVar8;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar285 = auVar284 & auVar344 | auVar285;
              auVar63 = packssdw(auVar285,auVar285);
              auVar63 = packssdw(auVar63 ^ auVar401,auVar63 ^ auVar401);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar63 = auVar429 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar379._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar379._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar286._4_4_ = iVar115;
              auVar286._0_4_ = iVar115;
              auVar286._8_4_ = iVar178;
              auVar286._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar345._4_4_ = iVar115;
              auVar345._0_4_ = iVar115;
              auVar345._8_4_ = iVar178;
              auVar345._12_4_ = iVar178;
              auVar379._0_4_ = auVar379._4_4_;
              auVar379._8_4_ = auVar379._12_4_;
              auVar63 = auVar345 & auVar286 | auVar379;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar401,auVar63 ^ auVar401);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar63 = pshufhw(auVar63,auVar286,0x84);
              auVar68 = pshufhw(auVar286,auVar345,0x84);
              auVar67 = pshufhw(auVar63,auVar379,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar401;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar63 = auVar441 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar288._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar288._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar346._4_4_ = iVar115;
              auVar346._0_4_ = iVar115;
              auVar346._8_4_ = iVar178;
              auVar346._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243 & auVar35,auVar346,0xe8);
              auVar221._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar221._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar221._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar221._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar287._4_4_ = auVar221._4_4_;
              auVar287._0_4_ = auVar221._4_4_;
              auVar287._8_4_ = auVar221._12_4_;
              auVar287._12_4_ = auVar221._12_4_;
              auVar35 = pshuflw(auVar221,auVar287,0xe8);
              auVar288._0_4_ = auVar288._4_4_;
              auVar288._8_4_ = auVar288._12_4_;
              auVar63 = pshuflw(auVar243,auVar288,0xe8);
              auVar63 = (auVar63 | auVar35 & auVar243) ^ auVar401;
              auVar35 = packssdw(auVar35 & auVar243,auVar63);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar288 = auVar287 & auVar346 | auVar288;
              auVar243 = packssdw(auVar288,auVar288);
              auVar35 = packssdw(auVar35,auVar243 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar453 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar380._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar380._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar289._4_4_ = iVar115;
              auVar289._0_4_ = iVar115;
              auVar289._8_4_ = iVar178;
              auVar289._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar347._4_4_ = iVar115;
              auVar347._0_4_ = iVar115;
              auVar347._8_4_ = iVar178;
              auVar347._12_4_ = iVar178;
              auVar380._0_4_ = auVar380._4_4_;
              auVar380._8_4_ = auVar380._12_4_;
              auVar35 = auVar347 & auVar289 | auVar380;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar401,auVar35 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar35 = pshufhw(auVar35,auVar289,0x84);
              auVar67 = pshufhw(auVar289,auVar347,0x84);
              auVar243 = pshufhw(auVar35,auVar380,0x84);
              auVar35 = (auVar243 | auVar67 & auVar35) ^ auVar401;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar35 = auVar175 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar291._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar291._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar348._4_4_ = iVar115;
              auVar348._0_4_ = iVar115;
              auVar348._8_4_ = iVar178;
              auVar348._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar348,0xe8);
              auVar222._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar222._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar222._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar222._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar290._4_4_ = auVar222._4_4_;
              auVar290._0_4_ = auVar222._4_4_;
              auVar290._8_4_ = auVar222._12_4_;
              auVar290._12_4_ = auVar222._12_4_;
              auVar35 = pshuflw(auVar222,auVar290,0xe8);
              auVar291._0_4_ = auVar291._4_4_;
              auVar291._8_4_ = auVar291._12_4_;
              auVar243 = pshuflw(auVar63,auVar291,0xe8);
              auVar243 = (auVar243 | auVar35 & auVar63) ^ auVar401;
              auVar243 = packssdw(auVar243,auVar243);
              auVar35 = packsswb(auVar35 & auVar63,auVar243);
              if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar291 = auVar290 & auVar348 | auVar291;
              auVar63 = packssdw(auVar291,auVar291);
              auVar63 = packssdw(auVar63 ^ auVar401,auVar63 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar63);
              if ((auVar35._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar35 = auVar110 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar381._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar381._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar292._4_4_ = iVar115;
              auVar292._0_4_ = iVar115;
              auVar292._8_4_ = iVar178;
              auVar292._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar349._4_4_ = iVar115;
              auVar349._0_4_ = iVar115;
              auVar349._8_4_ = iVar178;
              auVar349._12_4_ = iVar178;
              auVar381._0_4_ = auVar381._4_4_;
              auVar381._8_4_ = auVar381._12_4_;
              auVar35 = auVar349 & auVar292 | auVar381;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar401,auVar35 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar35 = pshufhw(auVar35,auVar292,0x84);
              auVar67 = pshufhw(auVar292,auVar349,0x84);
              auVar63 = pshufhw(auVar35,auVar381,0x84);
              auVar35 = (auVar63 | auVar67 & auVar35) ^ auVar401;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar35 = auVar84 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar294._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar294._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar350._4_4_ = iVar115;
              auVar350._0_4_ = iVar115;
              auVar350._8_4_ = iVar178;
              auVar350._12_4_ = iVar178;
              auVar63 = pshuflw(auVar243,auVar350,0xe8);
              auVar223._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar223._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar223._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar223._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar293._4_4_ = auVar223._4_4_;
              auVar293._0_4_ = auVar223._4_4_;
              auVar293._8_4_ = auVar223._12_4_;
              auVar293._12_4_ = auVar223._12_4_;
              auVar35 = pshuflw(auVar223,auVar293,0xe8);
              auVar294._0_4_ = auVar294._4_4_;
              auVar294._8_4_ = auVar294._12_4_;
              auVar243 = pshuflw(auVar63,auVar294,0xe8);
              in_XMM11 = (auVar243 | auVar35 & auVar63) ^ auVar401;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM11);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar294 = auVar293 & auVar350 | auVar294;
              auVar63 = packssdw(auVar294,auVar294);
              auVar35 = packssdw(auVar35,auVar63 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar49 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar35._0_4_);
              auVar351._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar368 = -(uint)(iVar368 < auVar35._8_4_);
              auVar351._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar295._4_4_ = iVar113;
              auVar295._0_4_ = iVar113;
              auVar295._8_4_ = iVar368;
              auVar295._12_4_ = iVar368;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar31._4_4_ = iVar113;
              auVar31._0_4_ = iVar113;
              auVar31._8_4_ = iVar114;
              auVar31._12_4_ = iVar114;
              auVar351._0_4_ = auVar351._4_4_;
              auVar351._8_4_ = auVar351._12_4_;
              auVar35 = auVar31 & auVar295 | auVar351;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar401,auVar35 ^ auVar401);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar63 = pshufhw(auVar35,auVar295,0x84);
              auVar35 = pshufhw(auVar31,auVar31,0x84);
              auVar243 = pshufhw(auVar63,auVar351,0x84);
              in_XMM5 = (auVar243 | auVar35 & auVar63) ^ auVar401;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM5);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar417._8_8_;
              auVar417._0_8_ = auVar417._0_8_ + 0x10;
              auVar417._8_8_ = lVar9 + 0x10;
              lVar9 = auVar429._8_8_;
              auVar429._0_8_ = auVar429._0_8_ + 0x10;
              auVar429._8_8_ = lVar9 + 0x10;
              lVar9 = auVar441._8_8_;
              auVar441._0_8_ = auVar441._0_8_ + 0x10;
              auVar441._8_8_ = lVar9 + 0x10;
              lVar9 = auVar453._8_8_;
              auVar453._0_8_ = auVar453._0_8_ + 0x10;
              auVar453._8_8_ = lVar9 + 0x10;
              lVar9 = auVar175._8_8_;
              auVar175._0_8_ = auVar175._0_8_ + 0x10;
              auVar175._8_8_ = lVar9 + 0x10;
              lVar9 = auVar110._8_8_;
              auVar110._0_8_ = auVar110._0_8_ + 0x10;
              auVar110._8_8_ = lVar9 + 0x10;
              lVar9 = auVar84._8_8_;
              auVar84._0_8_ = auVar84._0_8_ + 0x10;
              auVar84._8_8_ = lVar9 + 0x10;
              lVar9 = auVar49._8_8_;
              auVar49._0_8_ = auVar49._0_8_ + 0x10;
              auVar49._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        uVar15 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            do {
              pRVar19[uVar8 * 2] = ((byte)(uVar15 >> 1) ^ 0x80) + cVar4 * '\x02';
              pRVar19[uVar8 * 2 + 1] = cVar4 * '\x05' + '@' + (char)uVar8;
              uVar8 = uVar8 + 1;
            } while (width >> 1 != uVar8);
          }
          uVar15 = uVar15 + 1;
          pRVar19 = pRVar19 + hor_stride;
        } while (uVar15 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV420P:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar108._8_4_ = (int)lVar9;
        auVar108._0_8_ = lVar9;
        auVar108._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar17 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar391._8_4_ = 0xffffffff;
        auVar391._0_8_ = 0xffffffffffffffff;
        auVar391._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar47 = _DAT_00118210;
            auVar82 = _DAT_00118220;
            auVar399 = _DAT_00118280;
            auVar407 = _DAT_00118270;
            auVar415 = _DAT_00118260;
            auVar427 = _DAT_00118250;
            auVar439 = _DAT_00118240;
            auVar451 = _DAT_00118230;
            do {
              auVar35 = auVar108 ^ _DAT_00118290;
              auVar41 = auVar399 ^ _DAT_00118290;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              iVar114 = auVar35._4_4_;
              auVar152._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              iVar37 = auVar35._12_4_;
              auVar152._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar205._4_4_ = iVar115;
              auVar205._0_4_ = iVar115;
              auVar205._8_4_ = iVar178;
              auVar205._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM7,auVar205,0xe8);
              auVar151._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar151._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar151._0_4_ = auVar151._4_4_;
              auVar151._8_4_ = auVar151._12_4_;
              auVar63 = pshuflw(in_XMM8,auVar151,0xe8);
              auVar152._0_4_ = auVar152._4_4_;
              auVar152._8_4_ = auVar152._12_4_;
              auVar41 = pshuflw(auVar35,auVar152,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar391;
              auVar41 = packssdw(auVar41,auVar41);
              cVar2 = (char)uVar17;
              cVar3 = (char)uVar8;
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar152 = auVar151 & auVar205 | auVar152;
              auVar41 = packssdw(auVar152,auVar152);
              auVar41 = packssdw(auVar41 ^ auVar391,auVar41 ^ auVar391);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar41 = auVar407 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar276._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar276._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar153._4_4_ = iVar115;
              auVar153._0_4_ = iVar115;
              auVar153._8_4_ = iVar178;
              auVar153._12_4_ = iVar178;
              auVar206._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar206._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar206._0_4_ = auVar206._4_4_;
              auVar206._8_4_ = auVar206._12_4_;
              auVar276._0_4_ = auVar276._4_4_;
              auVar276._8_4_ = auVar276._12_4_;
              auVar41 = auVar206 & auVar153 | auVar276;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar391,auVar41 ^ auVar391);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar243 = pshufhw(auVar153,auVar153,0x84);
              auVar68 = pshufhw(auVar206,auVar206,0x84);
              auVar67 = pshufhw(auVar243,auVar276,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar391;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar243 = auVar415 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar155._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar155._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar207._4_4_ = iVar115;
              auVar207._0_4_ = iVar115;
              auVar207._8_4_ = iVar178;
              auVar207._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar207,0xe8);
              auVar154._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar154._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar154._0_4_ = auVar154._4_4_;
              auVar154._8_4_ = auVar154._12_4_;
              auVar63 = pshuflw(auVar63 & auVar35,auVar154,0xe8);
              auVar155._0_4_ = auVar155._4_4_;
              auVar155._8_4_ = auVar155._12_4_;
              auVar35 = pshuflw(auVar41,auVar155,0xe8);
              auVar35 = (auVar35 | auVar63 & auVar41) ^ auVar391;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar155 = auVar154 & auVar207 | auVar155;
              auVar35 = packssdw(auVar155,auVar155);
              auVar35 = packssdw(auVar35 ^ auVar391,auVar35 ^ auVar391);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar427 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar277._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar277._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar156._4_4_ = iVar115;
              auVar156._0_4_ = iVar115;
              auVar156._8_4_ = iVar178;
              auVar156._12_4_ = iVar178;
              auVar208._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar208._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar208._0_4_ = auVar208._4_4_;
              auVar208._8_4_ = auVar208._12_4_;
              auVar277._0_4_ = auVar277._4_4_;
              auVar277._8_4_ = auVar277._12_4_;
              auVar35 = auVar208 & auVar156 | auVar277;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar391,auVar35 ^ auVar391);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar243 = pshufhw(auVar156,auVar156,0x84);
              auVar68 = pshufhw(auVar208,auVar208,0x84);
              auVar67 = pshufhw(auVar243,auVar277,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar391;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar243 = auVar439 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar158._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar158._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar209._4_4_ = iVar115;
              auVar209._0_4_ = iVar115;
              auVar209._8_4_ = iVar178;
              auVar209._12_4_ = iVar178;
              auVar35 = pshuflw(auVar35,auVar209,0xe8);
              auVar157._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar157._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar157._0_4_ = auVar157._4_4_;
              auVar157._8_4_ = auVar157._12_4_;
              auVar63 = pshuflw(auVar63 & auVar41,auVar157,0xe8);
              auVar158._0_4_ = auVar158._4_4_;
              auVar158._8_4_ = auVar158._12_4_;
              auVar41 = pshuflw(auVar35,auVar158,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar391;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar158 = auVar157 & auVar209 | auVar158;
              auVar41 = packssdw(auVar158,auVar158);
              auVar41 = packssdw(auVar41 ^ auVar391,auVar41 ^ auVar391);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar41 = auVar451 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar278._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar278._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar159._4_4_ = iVar115;
              auVar159._0_4_ = iVar115;
              auVar159._8_4_ = iVar178;
              auVar159._12_4_ = iVar178;
              auVar210._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar210._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar210._0_4_ = auVar210._4_4_;
              auVar210._8_4_ = auVar210._12_4_;
              auVar278._0_4_ = auVar278._4_4_;
              auVar278._8_4_ = auVar278._12_4_;
              auVar41 = auVar210 & auVar159 | auVar278;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar391,auVar41 ^ auVar391);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar243 = pshufhw(auVar159,auVar159,0x84);
              auVar68 = pshufhw(auVar210,auVar210,0x84);
              auVar67 = pshufhw(auVar243,auVar278,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar391;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar243 = auVar82 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar161._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar161._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar211._4_4_ = iVar115;
              auVar211._0_4_ = iVar115;
              auVar211._8_4_ = iVar178;
              auVar211._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar211,0xe8);
              auVar160._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar160._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar160._0_4_ = auVar160._4_4_;
              auVar160._8_4_ = auVar160._12_4_;
              auVar35 = pshuflw(auVar63 & auVar35,auVar160,0xe8);
              in_XMM8 = auVar35 & auVar41;
              auVar161._0_4_ = auVar161._4_4_;
              auVar161._8_4_ = auVar161._12_4_;
              auVar35 = pshuflw(auVar41,auVar161,0xe8);
              auVar35 = (auVar35 | in_XMM8) ^ auVar391;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar161 = auVar160 & auVar211 | auVar161;
              auVar35 = packssdw(auVar161,auVar161);
              auVar35 = packssdw(auVar35 ^ auVar391,auVar35 ^ auVar391);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar47 ^ _DAT_00118290;
              auVar279._0_4_ = -(uint)(iVar113 < auVar35._0_4_);
              auVar279._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              auVar279._8_4_ = -(uint)(iVar368 < auVar35._8_4_);
              auVar279._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar162._4_4_ = auVar279._0_4_;
              auVar162._0_4_ = auVar279._0_4_;
              auVar162._8_4_ = auVar279._8_4_;
              auVar162._12_4_ = auVar279._8_4_;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar28._4_4_ = iVar113;
              auVar28._0_4_ = iVar113;
              auVar28._8_4_ = iVar114;
              auVar28._12_4_ = iVar114;
              auVar212._4_4_ = auVar279._4_4_;
              auVar212._0_4_ = auVar279._4_4_;
              auVar212._8_4_ = auVar279._12_4_;
              auVar212._12_4_ = auVar279._12_4_;
              in_XMM7 = auVar28 & auVar162 | auVar212;
              auVar35 = packssdw(auVar279,in_XMM7);
              auVar35 = packssdw(auVar35 ^ auVar391,auVar35 ^ auVar391);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar41 = pshufhw(auVar162,auVar162,0x84);
              auVar35 = pshufhw(auVar28,auVar28,0x84);
              auVar63 = pshufhw(auVar41,auVar212,0x84);
              auVar35 = packssdw(auVar35 & auVar41,(auVar63 | auVar35 & auVar41) ^ auVar391);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar399._8_8_;
              auVar399._0_8_ = auVar399._0_8_ + 0x10;
              auVar399._8_8_ = lVar9 + 0x10;
              lVar9 = auVar407._8_8_;
              auVar407._0_8_ = auVar407._0_8_ + 0x10;
              auVar407._8_8_ = lVar9 + 0x10;
              lVar9 = auVar415._8_8_;
              auVar415._0_8_ = auVar415._0_8_ + 0x10;
              auVar415._8_8_ = lVar9 + 0x10;
              lVar9 = auVar427._8_8_;
              auVar427._0_8_ = auVar427._0_8_ + 0x10;
              auVar427._8_8_ = lVar9 + 0x10;
              lVar9 = auVar439._8_8_;
              auVar439._0_8_ = auVar439._0_8_ + 0x10;
              auVar439._8_8_ = lVar9 + 0x10;
              lVar9 = auVar451._8_8_;
              auVar451._0_8_ = auVar451._0_8_ + 0x10;
              auVar451._8_8_ = lVar9 + 0x10;
              lVar9 = auVar82._8_8_;
              auVar82._0_8_ = auVar82._0_8_ + 0x10;
              auVar82._8_8_ = lVar9 + 0x10;
              lVar9 = auVar47._8_8_;
              auVar47._0_8_ = auVar47._0_8_ + 0x10;
              auVar47._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar17 = uVar17 + 1;
        } while (RVar13 != height);
        if (height != 1) {
          local_48._4_4_ = 0;
          local_48._0_4_ = width >> 1;
          uVar17 = 0;
          pRVar10 = pRVar19;
          do {
            if (1 < width) {
              memset(pRVar10,(uVar17 ^ 0x80) + frame_count * 2,(ulong)((width >> 1) - 1) + 1);
            }
            uVar17 = uVar17 + 1;
            pRVar10 = pRVar10 + (hor_stride >> 1);
          } while (height >> 1 != uVar17);
          if (height != 1) {
            pRVar19 = pRVar19 + (uVar15 >> 2);
            lVar9 = local_48._0_8_ + -1;
            auVar109._8_4_ = (int)lVar9;
            auVar109._0_8_ = lVar9;
            auVar109._12_4_ = (int)((ulong)lVar9 >> 0x20);
            cVar4 = cVar4 * '\x05';
            uVar15 = 0;
            auVar392._8_4_ = 0xffffffff;
            auVar392._0_8_ = 0xffffffffffffffff;
            auVar392._12_4_ = 0xffffffff;
            do {
              if (1 < width) {
                uVar8 = 0;
                auVar48 = _DAT_00118210;
                auVar83 = _DAT_00118220;
                auVar400 = _DAT_00118280;
                auVar408 = _DAT_00118270;
                auVar416 = _DAT_00118260;
                auVar428 = _DAT_00118250;
                auVar440 = _DAT_00118240;
                auVar452 = _DAT_00118230;
                do {
                  auVar35 = auVar109 ^ _DAT_00118290;
                  auVar41 = auVar400 ^ _DAT_00118290;
                  iVar113 = auVar35._0_4_;
                  iVar115 = -(uint)(iVar113 < auVar41._0_4_);
                  iVar114 = auVar35._4_4_;
                  auVar164._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
                  iVar368 = auVar35._8_4_;
                  iVar178 = -(uint)(iVar368 < auVar41._8_4_);
                  iVar37 = auVar35._12_4_;
                  auVar164._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
                  auVar213._4_4_ = iVar115;
                  auVar213._0_4_ = iVar115;
                  auVar213._8_4_ = iVar178;
                  auVar213._12_4_ = iVar178;
                  auVar35 = pshuflw(in_XMM7,auVar213,0xe8);
                  auVar163._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
                  auVar163._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
                  auVar163._0_4_ = auVar163._4_4_;
                  auVar163._8_4_ = auVar163._12_4_;
                  auVar63 = pshuflw(in_XMM8,auVar163,0xe8);
                  auVar164._0_4_ = auVar164._4_4_;
                  auVar164._8_4_ = auVar164._12_4_;
                  auVar41 = pshuflw(auVar35,auVar164,0xe8);
                  auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar392;
                  auVar41 = packssdw(auVar41,auVar41);
                  cVar2 = (char)uVar8;
                  if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pRVar19[uVar8] = cVar4 + cVar2 + '@';
                  }
                  auVar164 = auVar163 & auVar213 | auVar164;
                  auVar41 = packssdw(auVar164,auVar164);
                  auVar41 = packssdw(auVar41 ^ auVar392,auVar41 ^ auVar392);
                  auVar41 = packsswb(auVar41,auVar41);
                  if ((auVar41._0_4_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 1] = cVar4 + cVar2 + 'A';
                  }
                  auVar41 = auVar408 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar41._0_4_);
                  auVar280._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar41._8_4_);
                  auVar280._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
                  auVar165._4_4_ = iVar115;
                  auVar165._0_4_ = iVar115;
                  auVar165._8_4_ = iVar178;
                  auVar165._12_4_ = iVar178;
                  auVar214._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
                  auVar214._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
                  auVar214._0_4_ = auVar214._4_4_;
                  auVar214._8_4_ = auVar214._12_4_;
                  auVar280._0_4_ = auVar280._4_4_;
                  auVar280._8_4_ = auVar280._12_4_;
                  auVar41 = auVar214 & auVar165 | auVar280;
                  auVar41 = packssdw(auVar41,auVar41);
                  auVar41 = packssdw(auVar41 ^ auVar392,auVar41 ^ auVar392);
                  auVar41 = packsswb(auVar41,auVar41);
                  if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
                    pRVar19[uVar8 + 2] = cVar4 + cVar2 + 'B';
                  }
                  auVar243 = pshufhw(auVar165,auVar165,0x84);
                  auVar68 = pshufhw(auVar214,auVar214,0x84);
                  auVar67 = pshufhw(auVar243,auVar280,0x84);
                  auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar392;
                  auVar243 = packssdw(auVar243,auVar243);
                  auVar243 = packsswb(auVar243,auVar243);
                  if ((auVar243._0_4_ >> 0x18 & 1) != 0) {
                    pRVar19[uVar8 + 3] = cVar4 + cVar2 + 'C';
                  }
                  auVar243 = auVar416 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar243._0_4_);
                  auVar167._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar243._8_4_);
                  auVar167._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
                  auVar215._4_4_ = iVar115;
                  auVar215._0_4_ = iVar115;
                  auVar215._8_4_ = iVar178;
                  auVar215._12_4_ = iVar178;
                  auVar41 = pshuflw(auVar41,auVar215,0xe8);
                  auVar166._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
                  auVar166._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
                  auVar166._0_4_ = auVar166._4_4_;
                  auVar166._8_4_ = auVar166._12_4_;
                  auVar63 = pshuflw(auVar63 & auVar35,auVar166,0xe8);
                  auVar167._0_4_ = auVar167._4_4_;
                  auVar167._8_4_ = auVar167._12_4_;
                  auVar35 = pshuflw(auVar41,auVar167,0xe8);
                  auVar35 = (auVar35 | auVar63 & auVar41) ^ auVar392;
                  auVar35 = packssdw(auVar35,auVar35);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 4] = cVar4 + cVar2 + 'D';
                  }
                  auVar167 = auVar166 & auVar215 | auVar167;
                  auVar35 = packssdw(auVar167,auVar167);
                  auVar35 = packssdw(auVar35 ^ auVar392,auVar35 ^ auVar392);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35._4_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 5] = cVar4 + cVar2 + 'E';
                  }
                  auVar35 = auVar428 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar35._0_4_);
                  auVar281._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar35._8_4_);
                  auVar281._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
                  auVar168._4_4_ = iVar115;
                  auVar168._0_4_ = iVar115;
                  auVar168._8_4_ = iVar178;
                  auVar168._12_4_ = iVar178;
                  auVar216._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
                  auVar216._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
                  auVar216._0_4_ = auVar216._4_4_;
                  auVar216._8_4_ = auVar216._12_4_;
                  auVar281._0_4_ = auVar281._4_4_;
                  auVar281._8_4_ = auVar281._12_4_;
                  auVar35 = auVar216 & auVar168 | auVar281;
                  auVar35 = packssdw(auVar35,auVar35);
                  auVar35 = packssdw(auVar35 ^ auVar392,auVar35 ^ auVar392);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 6] = cVar4 + cVar2 + 'F';
                  }
                  auVar243 = pshufhw(auVar168,auVar168,0x84);
                  auVar68 = pshufhw(auVar216,auVar216,0x84);
                  auVar67 = pshufhw(auVar243,auVar281,0x84);
                  auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar392;
                  auVar243 = packssdw(auVar243,auVar243);
                  auVar243 = packsswb(auVar243,auVar243);
                  if ((auVar243._6_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 7] = cVar4 + cVar2 + 'G';
                  }
                  auVar243 = auVar440 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar243._0_4_);
                  auVar170._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar243._8_4_);
                  auVar170._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
                  auVar217._4_4_ = iVar115;
                  auVar217._0_4_ = iVar115;
                  auVar217._8_4_ = iVar178;
                  auVar217._12_4_ = iVar178;
                  auVar35 = pshuflw(auVar35,auVar217,0xe8);
                  auVar169._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
                  auVar169._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
                  auVar169._0_4_ = auVar169._4_4_;
                  auVar169._8_4_ = auVar169._12_4_;
                  auVar63 = pshuflw(auVar63 & auVar41,auVar169,0xe8);
                  auVar170._0_4_ = auVar170._4_4_;
                  auVar170._8_4_ = auVar170._12_4_;
                  auVar41 = pshuflw(auVar35,auVar170,0xe8);
                  auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar392;
                  auVar41 = packssdw(auVar41,auVar41);
                  auVar41 = packsswb(auVar41,auVar41);
                  if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 8] = cVar4 + cVar2 + 'H';
                  }
                  auVar170 = auVar169 & auVar217 | auVar170;
                  auVar41 = packssdw(auVar170,auVar170);
                  auVar41 = packssdw(auVar41 ^ auVar392,auVar41 ^ auVar392);
                  auVar41 = packsswb(auVar41,auVar41);
                  if ((auVar41._8_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 9] = cVar4 + cVar2 + 'I';
                  }
                  auVar41 = auVar452 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar41._0_4_);
                  auVar282._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar41._8_4_);
                  auVar282._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
                  auVar171._4_4_ = iVar115;
                  auVar171._0_4_ = iVar115;
                  auVar171._8_4_ = iVar178;
                  auVar171._12_4_ = iVar178;
                  auVar218._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
                  auVar218._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
                  auVar218._0_4_ = auVar218._4_4_;
                  auVar218._8_4_ = auVar218._12_4_;
                  auVar282._0_4_ = auVar282._4_4_;
                  auVar282._8_4_ = auVar282._12_4_;
                  auVar41 = auVar218 & auVar171 | auVar282;
                  auVar41 = packssdw(auVar41,auVar41);
                  auVar41 = packssdw(auVar41 ^ auVar392,auVar41 ^ auVar392);
                  auVar41 = packsswb(auVar41,auVar41);
                  if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 10] = cVar4 + cVar2 + 'J';
                  }
                  auVar243 = pshufhw(auVar171,auVar171,0x84);
                  auVar68 = pshufhw(auVar218,auVar218,0x84);
                  auVar67 = pshufhw(auVar243,auVar282,0x84);
                  auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar392;
                  auVar243 = packssdw(auVar243,auVar243);
                  auVar243 = packsswb(auVar243,auVar243);
                  if ((auVar243._10_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 0xb] = cVar4 + cVar2 + 'K';
                  }
                  auVar243 = auVar83 ^ _DAT_00118290;
                  iVar115 = -(uint)(iVar113 < auVar243._0_4_);
                  auVar173._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
                  iVar178 = -(uint)(iVar368 < auVar243._8_4_);
                  auVar173._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
                  auVar219._4_4_ = iVar115;
                  auVar219._0_4_ = iVar115;
                  auVar219._8_4_ = iVar178;
                  auVar219._12_4_ = iVar178;
                  auVar41 = pshuflw(auVar41,auVar219,0xe8);
                  auVar172._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
                  auVar172._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
                  auVar172._0_4_ = auVar172._4_4_;
                  auVar172._8_4_ = auVar172._12_4_;
                  auVar35 = pshuflw(auVar63 & auVar35,auVar172,0xe8);
                  in_XMM8 = auVar35 & auVar41;
                  auVar173._0_4_ = auVar173._4_4_;
                  auVar173._8_4_ = auVar173._12_4_;
                  auVar35 = pshuflw(auVar41,auVar173,0xe8);
                  auVar35 = (auVar35 | in_XMM8) ^ auVar392;
                  auVar35 = packssdw(auVar35,auVar35);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 0xc] = cVar4 + cVar2 + 'L';
                  }
                  auVar173 = auVar172 & auVar219 | auVar173;
                  auVar35 = packssdw(auVar173,auVar173);
                  auVar35 = packssdw(auVar35 ^ auVar392,auVar35 ^ auVar392);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35._12_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 0xd] = cVar4 + cVar2 + 'M';
                  }
                  auVar35 = auVar48 ^ _DAT_00118290;
                  auVar283._0_4_ = -(uint)(iVar113 < auVar35._0_4_);
                  auVar283._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
                  auVar283._8_4_ = -(uint)(iVar368 < auVar35._8_4_);
                  auVar283._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
                  auVar174._4_4_ = auVar283._0_4_;
                  auVar174._0_4_ = auVar283._0_4_;
                  auVar174._8_4_ = auVar283._8_4_;
                  auVar174._12_4_ = auVar283._8_4_;
                  iVar113 = -(uint)(auVar35._4_4_ == iVar114);
                  iVar114 = -(uint)(auVar35._12_4_ == iVar37);
                  auVar29._4_4_ = iVar113;
                  auVar29._0_4_ = iVar113;
                  auVar29._8_4_ = iVar114;
                  auVar29._12_4_ = iVar114;
                  auVar220._4_4_ = auVar283._4_4_;
                  auVar220._0_4_ = auVar283._4_4_;
                  auVar220._8_4_ = auVar283._12_4_;
                  auVar220._12_4_ = auVar283._12_4_;
                  in_XMM7 = auVar29 & auVar174 | auVar220;
                  auVar35 = packssdw(auVar283,in_XMM7);
                  auVar35 = packssdw(auVar35 ^ auVar392,auVar35 ^ auVar392);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pRVar19[uVar8 + 0xe] = cVar4 + cVar2 + 'N';
                  }
                  auVar41 = pshufhw(auVar174,auVar174,0x84);
                  auVar35 = pshufhw(auVar29,auVar29,0x84);
                  auVar63 = pshufhw(auVar41,auVar220,0x84);
                  auVar35 = packssdw(auVar35 & auVar41,(auVar63 | auVar35 & auVar41) ^ auVar392);
                  auVar35 = packsswb(auVar35,auVar35);
                  if ((auVar35._14_2_ >> 8 & 1) != 0) {
                    pRVar19[uVar8 + 0xf] = cVar4 + cVar2 + 'O';
                  }
                  uVar8 = uVar8 + 0x10;
                  lVar9 = auVar400._8_8_;
                  auVar400._0_8_ = auVar400._0_8_ + 0x10;
                  auVar400._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar408._8_8_;
                  auVar408._0_8_ = auVar408._0_8_ + 0x10;
                  auVar408._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar416._8_8_;
                  auVar416._0_8_ = auVar416._0_8_ + 0x10;
                  auVar416._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar428._8_8_;
                  auVar428._0_8_ = auVar428._0_8_ + 0x10;
                  auVar428._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar440._8_8_;
                  auVar440._0_8_ = auVar440._0_8_ + 0x10;
                  auVar440._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar452._8_8_;
                  auVar452._0_8_ = auVar452._0_8_ + 0x10;
                  auVar452._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar83._8_8_;
                  auVar83._0_8_ = auVar83._0_8_ + 0x10;
                  auVar83._8_8_ = lVar9 + 0x10;
                  lVar9 = auVar48._8_8_;
                  auVar48._0_8_ = auVar48._0_8_ + 0x10;
                  auVar48._8_8_ = lVar9 + 0x10;
                } while ((local_48._0_4_ + 0xfU & 0xfffffff0) != uVar8);
              }
              uVar15 = uVar15 + 1;
              pRVar19 = pRVar19 + (hor_stride >> 1);
            } while (uVar15 != height >> 1);
            return MPP_OK;
          }
        }
      }
      break;
    case MPP_FMT_YUV420SP_VU:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar32._8_4_ = (int)lVar9;
        auVar32._0_8_ = lVar9;
        auVar32._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar402._8_4_ = 0xffffffff;
        auVar402._0_8_ = 0xffffffffffffffff;
        auVar402._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar50 = _DAT_00118210;
            auVar85 = _DAT_00118220;
            auVar111 = _DAT_00118230;
            auVar176 = _DAT_00118240;
            auVar418 = _DAT_00118280;
            auVar430 = _DAT_00118270;
            auVar442 = _DAT_00118260;
            auVar454 = _DAT_00118250;
            do {
              auVar35 = auVar32 ^ auVar41;
              auVar63 = auVar418 ^ auVar41;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar35._4_4_;
              auVar297._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar35._12_4_;
              auVar297._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar352._4_4_ = iVar115;
              auVar352._0_4_ = iVar115;
              auVar352._8_4_ = iVar178;
              auVar352._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM5,auVar352,0xe8);
              auVar296._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar296._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar296._0_4_ = auVar296._4_4_;
              auVar296._8_4_ = auVar296._12_4_;
              auVar243 = pshuflw(in_XMM11,auVar296,0xe8);
              auVar297._0_4_ = auVar297._4_4_;
              auVar297._8_4_ = auVar297._12_4_;
              auVar63 = pshuflw(auVar35,auVar297,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar35) ^ auVar402;
              auVar63 = packssdw(auVar63,auVar63);
              cVar2 = (char)uVar15;
              cVar3 = (char)uVar8;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar297 = auVar296 & auVar352 | auVar297;
              auVar63 = packssdw(auVar297,auVar297);
              auVar63 = packssdw(auVar63 ^ auVar402,auVar63 ^ auVar402);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar63 = auVar430 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar382._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar382._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar298._4_4_ = iVar115;
              auVar298._0_4_ = iVar115;
              auVar298._8_4_ = iVar178;
              auVar298._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar353._4_4_ = iVar115;
              auVar353._0_4_ = iVar115;
              auVar353._8_4_ = iVar178;
              auVar353._12_4_ = iVar178;
              auVar382._0_4_ = auVar382._4_4_;
              auVar382._8_4_ = auVar382._12_4_;
              auVar63 = auVar353 & auVar298 | auVar382;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar402,auVar63 ^ auVar402);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar63 = pshufhw(auVar63,auVar298,0x84);
              auVar68 = pshufhw(auVar298,auVar353,0x84);
              auVar67 = pshufhw(auVar63,auVar382,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar402;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar63 = auVar442 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar300._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar300._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar354._4_4_ = iVar115;
              auVar354._0_4_ = iVar115;
              auVar354._8_4_ = iVar178;
              auVar354._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243 & auVar35,auVar354,0xe8);
              auVar224._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar224._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar224._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar224._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar299._4_4_ = auVar224._4_4_;
              auVar299._0_4_ = auVar224._4_4_;
              auVar299._8_4_ = auVar224._12_4_;
              auVar299._12_4_ = auVar224._12_4_;
              auVar35 = pshuflw(auVar224,auVar299,0xe8);
              auVar300._0_4_ = auVar300._4_4_;
              auVar300._8_4_ = auVar300._12_4_;
              auVar63 = pshuflw(auVar243,auVar300,0xe8);
              auVar63 = (auVar63 | auVar35 & auVar243) ^ auVar402;
              auVar35 = packssdw(auVar35 & auVar243,auVar63);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar300 = auVar299 & auVar354 | auVar300;
              auVar243 = packssdw(auVar300,auVar300);
              auVar35 = packssdw(auVar35,auVar243 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar454 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar383._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar383._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar301._4_4_ = iVar115;
              auVar301._0_4_ = iVar115;
              auVar301._8_4_ = iVar178;
              auVar301._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar355._4_4_ = iVar115;
              auVar355._0_4_ = iVar115;
              auVar355._8_4_ = iVar178;
              auVar355._12_4_ = iVar178;
              auVar383._0_4_ = auVar383._4_4_;
              auVar383._8_4_ = auVar383._12_4_;
              auVar35 = auVar355 & auVar301 | auVar383;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar402,auVar35 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar35 = pshufhw(auVar35,auVar301,0x84);
              auVar67 = pshufhw(auVar301,auVar355,0x84);
              auVar243 = pshufhw(auVar35,auVar383,0x84);
              auVar35 = (auVar243 | auVar67 & auVar35) ^ auVar402;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar35 = auVar176 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar303._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar303._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar356._4_4_ = iVar115;
              auVar356._0_4_ = iVar115;
              auVar356._8_4_ = iVar178;
              auVar356._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar356,0xe8);
              auVar225._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar225._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar225._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar225._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar302._4_4_ = auVar225._4_4_;
              auVar302._0_4_ = auVar225._4_4_;
              auVar302._8_4_ = auVar225._12_4_;
              auVar302._12_4_ = auVar225._12_4_;
              auVar35 = pshuflw(auVar225,auVar302,0xe8);
              auVar303._0_4_ = auVar303._4_4_;
              auVar303._8_4_ = auVar303._12_4_;
              auVar243 = pshuflw(auVar63,auVar303,0xe8);
              auVar243 = (auVar243 | auVar35 & auVar63) ^ auVar402;
              auVar243 = packssdw(auVar243,auVar243);
              auVar35 = packsswb(auVar35 & auVar63,auVar243);
              if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar303 = auVar302 & auVar356 | auVar303;
              auVar63 = packssdw(auVar303,auVar303);
              auVar63 = packssdw(auVar63 ^ auVar402,auVar63 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar63);
              if ((auVar35._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar35 = auVar111 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar384._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar384._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar304._4_4_ = iVar115;
              auVar304._0_4_ = iVar115;
              auVar304._8_4_ = iVar178;
              auVar304._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar357._4_4_ = iVar115;
              auVar357._0_4_ = iVar115;
              auVar357._8_4_ = iVar178;
              auVar357._12_4_ = iVar178;
              auVar384._0_4_ = auVar384._4_4_;
              auVar384._8_4_ = auVar384._12_4_;
              auVar35 = auVar357 & auVar304 | auVar384;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar402,auVar35 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar35 = pshufhw(auVar35,auVar304,0x84);
              auVar67 = pshufhw(auVar304,auVar357,0x84);
              auVar63 = pshufhw(auVar35,auVar384,0x84);
              auVar35 = (auVar63 | auVar67 & auVar35) ^ auVar402;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar35 = auVar85 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar306._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar306._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar358._4_4_ = iVar115;
              auVar358._0_4_ = iVar115;
              auVar358._8_4_ = iVar178;
              auVar358._12_4_ = iVar178;
              auVar63 = pshuflw(auVar243,auVar358,0xe8);
              auVar226._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar226._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar226._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar226._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar305._4_4_ = auVar226._4_4_;
              auVar305._0_4_ = auVar226._4_4_;
              auVar305._8_4_ = auVar226._12_4_;
              auVar305._12_4_ = auVar226._12_4_;
              auVar35 = pshuflw(auVar226,auVar305,0xe8);
              auVar306._0_4_ = auVar306._4_4_;
              auVar306._8_4_ = auVar306._12_4_;
              auVar243 = pshuflw(auVar63,auVar306,0xe8);
              in_XMM11 = (auVar243 | auVar35 & auVar63) ^ auVar402;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM11);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar306 = auVar305 & auVar358 | auVar306;
              auVar63 = packssdw(auVar306,auVar306);
              auVar35 = packssdw(auVar35,auVar63 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar50 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar35._0_4_);
              auVar359._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar368 = -(uint)(iVar368 < auVar35._8_4_);
              auVar359._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar307._4_4_ = iVar113;
              auVar307._0_4_ = iVar113;
              auVar307._8_4_ = iVar368;
              auVar307._12_4_ = iVar368;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar33._4_4_ = iVar113;
              auVar33._0_4_ = iVar113;
              auVar33._8_4_ = iVar114;
              auVar33._12_4_ = iVar114;
              auVar359._0_4_ = auVar359._4_4_;
              auVar359._8_4_ = auVar359._12_4_;
              auVar35 = auVar33 & auVar307 | auVar359;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar402,auVar35 ^ auVar402);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar63 = pshufhw(auVar35,auVar307,0x84);
              auVar35 = pshufhw(auVar33,auVar33,0x84);
              auVar243 = pshufhw(auVar63,auVar359,0x84);
              in_XMM5 = (auVar243 | auVar35 & auVar63) ^ auVar402;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM5);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar418._8_8_;
              auVar418._0_8_ = auVar418._0_8_ + 0x10;
              auVar418._8_8_ = lVar9 + 0x10;
              lVar9 = auVar430._8_8_;
              auVar430._0_8_ = auVar430._0_8_ + 0x10;
              auVar430._8_8_ = lVar9 + 0x10;
              lVar9 = auVar442._8_8_;
              auVar442._0_8_ = auVar442._0_8_ + 0x10;
              auVar442._8_8_ = lVar9 + 0x10;
              lVar9 = auVar454._8_8_;
              auVar454._0_8_ = auVar454._0_8_ + 0x10;
              auVar454._8_8_ = lVar9 + 0x10;
              lVar9 = auVar176._8_8_;
              auVar176._0_8_ = auVar176._0_8_ + 0x10;
              auVar176._8_8_ = lVar9 + 0x10;
              lVar9 = auVar111._8_8_;
              auVar111._0_8_ = auVar111._0_8_ + 0x10;
              auVar111._8_8_ = lVar9 + 0x10;
              lVar9 = auVar85._8_8_;
              auVar85._0_8_ = auVar85._0_8_ + 0x10;
              auVar85._8_8_ = lVar9 + 0x10;
              lVar9 = auVar50._8_8_;
              auVar50._0_8_ = auVar50._0_8_ + 0x10;
              auVar50._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        if (height != 1) {
          uVar15 = 0;
          do {
            if (1 < width) {
              uVar8 = 0;
              do {
                pRVar19[uVar8 * 2 + 1] = ((byte)uVar15 ^ 0x80) + cVar4 * '\x02';
                pRVar19[uVar8 * 2] = cVar4 * '\x05' + '@' + (char)uVar8;
                uVar8 = uVar8 + 1;
              } while (width >> 1 != uVar8);
            }
            uVar15 = uVar15 + 1;
            pRVar19 = pRVar19 + hor_stride;
          } while (uVar15 != height >> 1);
          return MPP_OK;
        }
      }
      break;
    case MPP_FMT_YUV422P:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar105._8_4_ = (int)lVar9;
        auVar105._0_8_ = lVar9;
        auVar105._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar17 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar389._8_4_ = 0xffffffff;
        auVar389._0_8_ = 0xffffffffffffffff;
        auVar389._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar44 = _DAT_00118210;
            auVar79 = _DAT_00118220;
            auVar396 = _DAT_00118280;
            auVar405 = _DAT_00118270;
            auVar412 = _DAT_00118260;
            auVar424 = _DAT_00118250;
            auVar436 = _DAT_00118240;
            auVar448 = _DAT_00118230;
            do {
              auVar35 = auVar105 ^ _DAT_00118290;
              auVar41 = auVar396 ^ _DAT_00118290;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              iVar114 = auVar35._4_4_;
              auVar127._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              iVar37 = auVar35._12_4_;
              auVar127._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar186._4_4_ = iVar115;
              auVar186._0_4_ = iVar115;
              auVar186._8_4_ = iVar178;
              auVar186._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM7,auVar186,0xe8);
              auVar126._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar126._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar126._0_4_ = auVar126._4_4_;
              auVar126._8_4_ = auVar126._12_4_;
              auVar63 = pshuflw(in_XMM8,auVar126,0xe8);
              auVar127._0_4_ = auVar127._4_4_;
              auVar127._8_4_ = auVar127._12_4_;
              auVar41 = pshuflw(auVar35,auVar127,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar389;
              auVar41 = packssdw(auVar41,auVar41);
              cVar2 = (char)uVar17;
              cVar3 = (char)uVar8;
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar127 = auVar126 & auVar186 | auVar127;
              auVar41 = packssdw(auVar127,auVar127);
              auVar41 = packssdw(auVar41 ^ auVar389,auVar41 ^ auVar389);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar41 = auVar405 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar256._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar256._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar128._4_4_ = iVar115;
              auVar128._0_4_ = iVar115;
              auVar128._8_4_ = iVar178;
              auVar128._12_4_ = iVar178;
              auVar187._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar187._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar187._0_4_ = auVar187._4_4_;
              auVar187._8_4_ = auVar187._12_4_;
              auVar256._0_4_ = auVar256._4_4_;
              auVar256._8_4_ = auVar256._12_4_;
              auVar41 = auVar187 & auVar128 | auVar256;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar389,auVar41 ^ auVar389);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar243 = pshufhw(auVar128,auVar128,0x84);
              auVar68 = pshufhw(auVar187,auVar187,0x84);
              auVar67 = pshufhw(auVar243,auVar256,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar389;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar243 = auVar412 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar130._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar130._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar188._4_4_ = iVar115;
              auVar188._0_4_ = iVar115;
              auVar188._8_4_ = iVar178;
              auVar188._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar188,0xe8);
              auVar129._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar129._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar129._0_4_ = auVar129._4_4_;
              auVar129._8_4_ = auVar129._12_4_;
              auVar63 = pshuflw(auVar63 & auVar35,auVar129,0xe8);
              auVar130._0_4_ = auVar130._4_4_;
              auVar130._8_4_ = auVar130._12_4_;
              auVar35 = pshuflw(auVar41,auVar130,0xe8);
              auVar35 = (auVar35 | auVar63 & auVar41) ^ auVar389;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar130 = auVar129 & auVar188 | auVar130;
              auVar35 = packssdw(auVar130,auVar130);
              auVar35 = packssdw(auVar35 ^ auVar389,auVar35 ^ auVar389);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar424 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar257._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar257._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar131._4_4_ = iVar115;
              auVar131._0_4_ = iVar115;
              auVar131._8_4_ = iVar178;
              auVar131._12_4_ = iVar178;
              auVar189._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar189._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar189._0_4_ = auVar189._4_4_;
              auVar189._8_4_ = auVar189._12_4_;
              auVar257._0_4_ = auVar257._4_4_;
              auVar257._8_4_ = auVar257._12_4_;
              auVar35 = auVar189 & auVar131 | auVar257;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar389,auVar35 ^ auVar389);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar243 = pshufhw(auVar131,auVar131,0x84);
              auVar68 = pshufhw(auVar189,auVar189,0x84);
              auVar67 = pshufhw(auVar243,auVar257,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar389;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar243 = auVar436 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar133._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar133._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar190._4_4_ = iVar115;
              auVar190._0_4_ = iVar115;
              auVar190._8_4_ = iVar178;
              auVar190._12_4_ = iVar178;
              auVar35 = pshuflw(auVar35,auVar190,0xe8);
              auVar132._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar132._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar132._0_4_ = auVar132._4_4_;
              auVar132._8_4_ = auVar132._12_4_;
              auVar63 = pshuflw(auVar63 & auVar41,auVar132,0xe8);
              auVar133._0_4_ = auVar133._4_4_;
              auVar133._8_4_ = auVar133._12_4_;
              auVar41 = pshuflw(auVar35,auVar133,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar389;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar133 = auVar132 & auVar190 | auVar133;
              auVar41 = packssdw(auVar133,auVar133);
              auVar41 = packssdw(auVar41 ^ auVar389,auVar41 ^ auVar389);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar41 = auVar448 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar258._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar258._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar134._4_4_ = iVar115;
              auVar134._0_4_ = iVar115;
              auVar134._8_4_ = iVar178;
              auVar134._12_4_ = iVar178;
              auVar191._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar191._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar191._0_4_ = auVar191._4_4_;
              auVar191._8_4_ = auVar191._12_4_;
              auVar258._0_4_ = auVar258._4_4_;
              auVar258._8_4_ = auVar258._12_4_;
              auVar41 = auVar191 & auVar134 | auVar258;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar389,auVar41 ^ auVar389);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar243 = pshufhw(auVar134,auVar134,0x84);
              auVar68 = pshufhw(auVar191,auVar191,0x84);
              auVar67 = pshufhw(auVar243,auVar258,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar389;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar243 = auVar79 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar136._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar136._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar192._4_4_ = iVar115;
              auVar192._0_4_ = iVar115;
              auVar192._8_4_ = iVar178;
              auVar192._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar192,0xe8);
              auVar135._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar135._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar135._0_4_ = auVar135._4_4_;
              auVar135._8_4_ = auVar135._12_4_;
              auVar35 = pshuflw(auVar63 & auVar35,auVar135,0xe8);
              in_XMM8 = auVar35 & auVar41;
              auVar136._0_4_ = auVar136._4_4_;
              auVar136._8_4_ = auVar136._12_4_;
              auVar35 = pshuflw(auVar41,auVar136,0xe8);
              auVar35 = (auVar35 | in_XMM8) ^ auVar389;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar136 = auVar135 & auVar192 | auVar136;
              auVar35 = packssdw(auVar136,auVar136);
              auVar35 = packssdw(auVar35 ^ auVar389,auVar35 ^ auVar389);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar44 ^ _DAT_00118290;
              auVar259._0_4_ = -(uint)(iVar113 < auVar35._0_4_);
              auVar259._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              auVar259._8_4_ = -(uint)(iVar368 < auVar35._8_4_);
              auVar259._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar137._4_4_ = auVar259._0_4_;
              auVar137._0_4_ = auVar259._0_4_;
              auVar137._8_4_ = auVar259._8_4_;
              auVar137._12_4_ = auVar259._8_4_;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar24._4_4_ = iVar113;
              auVar24._0_4_ = iVar113;
              auVar24._8_4_ = iVar114;
              auVar24._12_4_ = iVar114;
              auVar193._4_4_ = auVar259._4_4_;
              auVar193._0_4_ = auVar259._4_4_;
              auVar193._8_4_ = auVar259._12_4_;
              auVar193._12_4_ = auVar259._12_4_;
              in_XMM7 = auVar24 & auVar137 | auVar193;
              auVar35 = packssdw(auVar259,in_XMM7);
              auVar35 = packssdw(auVar35 ^ auVar389,auVar35 ^ auVar389);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar41 = pshufhw(auVar137,auVar137,0x84);
              auVar35 = pshufhw(auVar24,auVar24,0x84);
              auVar63 = pshufhw(auVar41,auVar193,0x84);
              auVar35 = packssdw(auVar35 & auVar41,(auVar63 | auVar35 & auVar41) ^ auVar389);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar396._8_8_;
              auVar396._0_8_ = auVar396._0_8_ + 0x10;
              auVar396._8_8_ = lVar9 + 0x10;
              lVar9 = auVar405._8_8_;
              auVar405._0_8_ = auVar405._0_8_ + 0x10;
              auVar405._8_8_ = lVar9 + 0x10;
              lVar9 = auVar412._8_8_;
              auVar412._0_8_ = auVar412._0_8_ + 0x10;
              auVar412._8_8_ = lVar9 + 0x10;
              lVar9 = auVar424._8_8_;
              auVar424._0_8_ = auVar424._0_8_ + 0x10;
              auVar424._8_8_ = lVar9 + 0x10;
              lVar9 = auVar436._8_8_;
              auVar436._0_8_ = auVar436._0_8_ + 0x10;
              auVar436._8_8_ = lVar9 + 0x10;
              lVar9 = auVar448._8_8_;
              auVar448._0_8_ = auVar448._0_8_ + 0x10;
              auVar448._8_8_ = lVar9 + 0x10;
              lVar9 = auVar79._8_8_;
              auVar79._0_8_ = auVar79._0_8_ + 0x10;
              auVar79._8_8_ = lVar9 + 0x10;
              lVar9 = auVar44._8_8_;
              auVar44._0_8_ = auVar44._0_8_ + 0x10;
              auVar44._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar17 = uVar17 + 1;
        } while (RVar13 != height);
        local_48._4_4_ = 0;
        local_48._0_4_ = width >> 1;
        uVar17 = 0;
        pRVar10 = pRVar19;
        do {
          if (1 < width) {
            memset(pRVar10,(uVar17 >> 1 ^ 0x80) + frame_count * 2,(ulong)((width >> 1) - 1) + 1);
          }
          uVar17 = uVar17 + 1;
          pRVar10 = pRVar10 + (hor_stride >> 1);
        } while (height != uVar17);
        pRVar19 = pRVar19 + (uVar15 >> 1);
        lVar9 = local_48._0_8_ + -1;
        auVar106._8_4_ = (int)lVar9;
        auVar106._0_8_ = lVar9;
        auVar106._12_4_ = (int)((ulong)lVar9 >> 0x20);
        cVar4 = cVar4 * '\x05';
        RVar13 = 0;
        auVar390._8_4_ = 0xffffffff;
        auVar390._0_8_ = 0xffffffffffffffff;
        auVar390._12_4_ = 0xffffffff;
        do {
          if (1 < width) {
            uVar8 = 0;
            auVar45 = _DAT_00118210;
            auVar80 = _DAT_00118220;
            auVar397 = _DAT_00118280;
            auVar406 = _DAT_00118270;
            auVar413 = _DAT_00118260;
            auVar425 = _DAT_00118250;
            auVar437 = _DAT_00118240;
            auVar449 = _DAT_00118230;
            do {
              auVar35 = auVar106 ^ _DAT_00118290;
              auVar41 = auVar397 ^ _DAT_00118290;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              iVar114 = auVar35._4_4_;
              auVar139._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              iVar37 = auVar35._12_4_;
              auVar139._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar194._4_4_ = iVar115;
              auVar194._0_4_ = iVar115;
              auVar194._8_4_ = iVar178;
              auVar194._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM7,auVar194,0xe8);
              auVar138._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar138._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar138._0_4_ = auVar138._4_4_;
              auVar138._8_4_ = auVar138._12_4_;
              auVar63 = pshuflw(in_XMM8,auVar138,0xe8);
              auVar139._0_4_ = auVar139._4_4_;
              auVar139._8_4_ = auVar139._12_4_;
              auVar41 = pshuflw(auVar35,auVar139,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar390;
              auVar41 = packssdw(auVar41,auVar41);
              cVar2 = (char)uVar8;
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar19[uVar8] = cVar4 + cVar2 + '@';
              }
              auVar139 = auVar138 & auVar194 | auVar139;
              auVar41 = packssdw(auVar139,auVar139);
              auVar41 = packssdw(auVar41 ^ auVar390,auVar41 ^ auVar390);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 1] = cVar4 + cVar2 + 'A';
              }
              auVar41 = auVar406 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar260._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar260._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar140._4_4_ = iVar115;
              auVar140._0_4_ = iVar115;
              auVar140._8_4_ = iVar178;
              auVar140._12_4_ = iVar178;
              auVar195._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar195._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar195._0_4_ = auVar195._4_4_;
              auVar195._8_4_ = auVar195._12_4_;
              auVar260._0_4_ = auVar260._4_4_;
              auVar260._8_4_ = auVar260._12_4_;
              auVar41 = auVar195 & auVar140 | auVar260;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar390,auVar41 ^ auVar390);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
                pRVar19[uVar8 + 2] = cVar4 + cVar2 + 'B';
              }
              auVar243 = pshufhw(auVar140,auVar140,0x84);
              auVar68 = pshufhw(auVar195,auVar195,0x84);
              auVar67 = pshufhw(auVar243,auVar260,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar390;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 0x18 & 1) != 0) {
                pRVar19[uVar8 + 3] = cVar4 + cVar2 + 'C';
              }
              auVar243 = auVar413 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar142._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar142._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar196._4_4_ = iVar115;
              auVar196._0_4_ = iVar115;
              auVar196._8_4_ = iVar178;
              auVar196._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar196,0xe8);
              auVar141._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar141._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar141._0_4_ = auVar141._4_4_;
              auVar141._8_4_ = auVar141._12_4_;
              auVar63 = pshuflw(auVar63 & auVar35,auVar141,0xe8);
              auVar142._0_4_ = auVar142._4_4_;
              auVar142._8_4_ = auVar142._12_4_;
              auVar35 = pshuflw(auVar41,auVar142,0xe8);
              auVar35 = (auVar35 | auVar63 & auVar41) ^ auVar390;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 4] = cVar4 + cVar2 + 'D';
              }
              auVar142 = auVar141 & auVar196 | auVar142;
              auVar35 = packssdw(auVar142,auVar142);
              auVar35 = packssdw(auVar35 ^ auVar390,auVar35 ^ auVar390);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 5] = cVar4 + cVar2 + 'E';
              }
              auVar35 = auVar425 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar261._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar261._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar143._4_4_ = iVar115;
              auVar143._0_4_ = iVar115;
              auVar143._8_4_ = iVar178;
              auVar143._12_4_ = iVar178;
              auVar197._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar197._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar197._0_4_ = auVar197._4_4_;
              auVar197._8_4_ = auVar197._12_4_;
              auVar261._0_4_ = auVar261._4_4_;
              auVar261._8_4_ = auVar261._12_4_;
              auVar35 = auVar197 & auVar143 | auVar261;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar390,auVar35 ^ auVar390);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 6] = cVar4 + cVar2 + 'F';
              }
              auVar243 = pshufhw(auVar143,auVar143,0x84);
              auVar68 = pshufhw(auVar197,auVar197,0x84);
              auVar67 = pshufhw(auVar243,auVar261,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar390;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._6_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 7] = cVar4 + cVar2 + 'G';
              }
              auVar243 = auVar437 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar145._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar145._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar198._4_4_ = iVar115;
              auVar198._0_4_ = iVar115;
              auVar198._8_4_ = iVar178;
              auVar198._12_4_ = iVar178;
              auVar35 = pshuflw(auVar35,auVar198,0xe8);
              auVar144._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar144._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar144._0_4_ = auVar144._4_4_;
              auVar144._8_4_ = auVar144._12_4_;
              auVar63 = pshuflw(auVar63 & auVar41,auVar144,0xe8);
              auVar145._0_4_ = auVar145._4_4_;
              auVar145._8_4_ = auVar145._12_4_;
              auVar41 = pshuflw(auVar35,auVar145,0xe8);
              auVar41 = (auVar41 | auVar63 & auVar35) ^ auVar390;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 8] = cVar4 + cVar2 + 'H';
              }
              auVar145 = auVar144 & auVar198 | auVar145;
              auVar41 = packssdw(auVar145,auVar145);
              auVar41 = packssdw(auVar41 ^ auVar390,auVar41 ^ auVar390);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._8_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 9] = cVar4 + cVar2 + 'I';
              }
              auVar41 = auVar449 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar262._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar262._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar146._4_4_ = iVar115;
              auVar146._0_4_ = iVar115;
              auVar146._8_4_ = iVar178;
              auVar146._12_4_ = iVar178;
              auVar199._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar199._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar199._0_4_ = auVar199._4_4_;
              auVar199._8_4_ = auVar199._12_4_;
              auVar262._0_4_ = auVar262._4_4_;
              auVar262._8_4_ = auVar262._12_4_;
              auVar41 = auVar199 & auVar146 | auVar262;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar390,auVar41 ^ auVar390);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 10] = cVar4 + cVar2 + 'J';
              }
              auVar243 = pshufhw(auVar146,auVar146,0x84);
              auVar68 = pshufhw(auVar199,auVar199,0x84);
              auVar67 = pshufhw(auVar243,auVar262,0x84);
              auVar243 = (auVar67 | auVar68 & auVar243) ^ auVar390;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._10_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 0xb] = cVar4 + cVar2 + 'K';
              }
              auVar243 = auVar80 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar148._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar148._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar200._4_4_ = iVar115;
              auVar200._0_4_ = iVar115;
              auVar200._8_4_ = iVar178;
              auVar200._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar200,0xe8);
              auVar147._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar147._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar147._0_4_ = auVar147._4_4_;
              auVar147._8_4_ = auVar147._12_4_;
              auVar35 = pshuflw(auVar63 & auVar35,auVar147,0xe8);
              in_XMM8 = auVar35 & auVar41;
              auVar148._0_4_ = auVar148._4_4_;
              auVar148._8_4_ = auVar148._12_4_;
              auVar35 = pshuflw(auVar41,auVar148,0xe8);
              auVar35 = (auVar35 | in_XMM8) ^ auVar390;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 0xc] = cVar4 + cVar2 + 'L';
              }
              auVar148 = auVar147 & auVar200 | auVar148;
              auVar35 = packssdw(auVar148,auVar148);
              auVar35 = packssdw(auVar35 ^ auVar390,auVar35 ^ auVar390);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 0xd] = cVar4 + cVar2 + 'M';
              }
              auVar35 = auVar45 ^ _DAT_00118290;
              auVar263._0_4_ = -(uint)(iVar113 < auVar35._0_4_);
              auVar263._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              auVar263._8_4_ = -(uint)(iVar368 < auVar35._8_4_);
              auVar263._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar149._4_4_ = auVar263._0_4_;
              auVar149._0_4_ = auVar263._0_4_;
              auVar149._8_4_ = auVar263._8_4_;
              auVar149._12_4_ = auVar263._8_4_;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar25._4_4_ = iVar113;
              auVar25._0_4_ = iVar113;
              auVar25._8_4_ = iVar114;
              auVar25._12_4_ = iVar114;
              auVar201._4_4_ = auVar263._4_4_;
              auVar201._0_4_ = auVar263._4_4_;
              auVar201._8_4_ = auVar263._12_4_;
              auVar201._12_4_ = auVar263._12_4_;
              in_XMM7 = auVar25 & auVar149 | auVar201;
              auVar35 = packssdw(auVar263,in_XMM7);
              auVar35 = packssdw(auVar35 ^ auVar390,auVar35 ^ auVar390);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar19[uVar8 + 0xe] = cVar4 + cVar2 + 'N';
              }
              auVar41 = pshufhw(auVar149,auVar149,0x84);
              auVar35 = pshufhw(auVar25,auVar25,0x84);
              auVar63 = pshufhw(auVar41,auVar201,0x84);
              auVar35 = packssdw(auVar35 & auVar41,(auVar63 | auVar35 & auVar41) ^ auVar390);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                pRVar19[uVar8 + 0xf] = cVar4 + cVar2 + 'O';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar397._8_8_;
              auVar397._0_8_ = auVar397._0_8_ + 0x10;
              auVar397._8_8_ = lVar9 + 0x10;
              lVar9 = auVar406._8_8_;
              auVar406._0_8_ = auVar406._0_8_ + 0x10;
              auVar406._8_8_ = lVar9 + 0x10;
              lVar9 = auVar413._8_8_;
              auVar413._0_8_ = auVar413._0_8_ + 0x10;
              auVar413._8_8_ = lVar9 + 0x10;
              lVar9 = auVar425._8_8_;
              auVar425._0_8_ = auVar425._0_8_ + 0x10;
              auVar425._8_8_ = lVar9 + 0x10;
              lVar9 = auVar437._8_8_;
              auVar437._0_8_ = auVar437._0_8_ + 0x10;
              auVar437._8_8_ = lVar9 + 0x10;
              lVar9 = auVar449._8_8_;
              auVar449._0_8_ = auVar449._0_8_ + 0x10;
              auVar449._8_8_ = lVar9 + 0x10;
              lVar9 = auVar80._8_8_;
              auVar80._0_8_ = auVar80._0_8_ + 0x10;
              auVar80._8_8_ = lVar9 + 0x10;
              lVar9 = auVar45._8_8_;
              auVar45._0_8_ = auVar45._0_8_ + 0x10;
              auVar45._8_8_ = lVar9 + 0x10;
            } while ((local_48._0_4_ + 0xfU & 0xfffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          pRVar19 = pRVar19 + (hor_stride >> 1);
        } while (RVar13 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422SP_VU:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar26._8_4_ = (int)lVar9;
        auVar26._0_8_ = lVar9;
        auVar26._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar398._8_4_ = 0xffffffff;
        auVar398._0_8_ = 0xffffffffffffffff;
        auVar398._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar46 = _DAT_00118210;
            auVar81 = _DAT_00118220;
            auVar107 = _DAT_00118230;
            auVar150 = _DAT_00118240;
            auVar414 = _DAT_00118280;
            auVar426 = _DAT_00118270;
            auVar438 = _DAT_00118260;
            auVar450 = _DAT_00118250;
            do {
              auVar35 = auVar26 ^ auVar41;
              auVar63 = auVar414 ^ auVar41;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar35._4_4_;
              auVar265._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar35._12_4_;
              auVar265._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar336._4_4_ = iVar115;
              auVar336._0_4_ = iVar115;
              auVar336._8_4_ = iVar178;
              auVar336._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM5,auVar336,0xe8);
              auVar264._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar264._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar264._0_4_ = auVar264._4_4_;
              auVar264._8_4_ = auVar264._12_4_;
              auVar243 = pshuflw(in_XMM11,auVar264,0xe8);
              auVar265._0_4_ = auVar265._4_4_;
              auVar265._8_4_ = auVar265._12_4_;
              auVar63 = pshuflw(auVar35,auVar265,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar35) ^ auVar398;
              auVar63 = packssdw(auVar63,auVar63);
              cVar2 = (char)uVar15;
              cVar3 = (char)uVar8;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar2 + cVar3;
              }
              auVar265 = auVar264 & auVar336 | auVar265;
              auVar63 = packssdw(auVar265,auVar265);
              auVar63 = packssdw(auVar63 ^ auVar398,auVar63 ^ auVar398);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar63 = auVar426 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar376._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar376._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar266._4_4_ = iVar115;
              auVar266._0_4_ = iVar115;
              auVar266._8_4_ = iVar178;
              auVar266._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar337._4_4_ = iVar115;
              auVar337._0_4_ = iVar115;
              auVar337._8_4_ = iVar178;
              auVar337._12_4_ = iVar178;
              auVar376._0_4_ = auVar376._4_4_;
              auVar376._8_4_ = auVar376._12_4_;
              auVar63 = auVar337 & auVar266 | auVar376;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar398,auVar63 ^ auVar398);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar63 = pshufhw(auVar63,auVar266,0x84);
              auVar68 = pshufhw(auVar266,auVar337,0x84);
              auVar67 = pshufhw(auVar63,auVar376,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar398;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar63 = auVar438 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar268._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar268._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar338._4_4_ = iVar115;
              auVar338._0_4_ = iVar115;
              auVar338._8_4_ = iVar178;
              auVar338._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243 & auVar35,auVar338,0xe8);
              auVar202._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar202._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar202._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar202._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar267._4_4_ = auVar202._4_4_;
              auVar267._0_4_ = auVar202._4_4_;
              auVar267._8_4_ = auVar202._12_4_;
              auVar267._12_4_ = auVar202._12_4_;
              auVar35 = pshuflw(auVar202,auVar267,0xe8);
              auVar268._0_4_ = auVar268._4_4_;
              auVar268._8_4_ = auVar268._12_4_;
              auVar63 = pshuflw(auVar243,auVar268,0xe8);
              auVar63 = (auVar63 | auVar35 & auVar243) ^ auVar398;
              auVar35 = packssdw(auVar35 & auVar243,auVar63);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar268 = auVar267 & auVar338 | auVar268;
              auVar243 = packssdw(auVar268,auVar268);
              auVar35 = packssdw(auVar35,auVar243 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar35 = auVar450 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar377._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar377._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar269._4_4_ = iVar115;
              auVar269._0_4_ = iVar115;
              auVar269._8_4_ = iVar178;
              auVar269._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar339._4_4_ = iVar115;
              auVar339._0_4_ = iVar115;
              auVar339._8_4_ = iVar178;
              auVar339._12_4_ = iVar178;
              auVar377._0_4_ = auVar377._4_4_;
              auVar377._8_4_ = auVar377._12_4_;
              auVar35 = auVar339 & auVar269 | auVar377;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar398,auVar35 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar35 = pshufhw(auVar35,auVar269,0x84);
              auVar67 = pshufhw(auVar269,auVar339,0x84);
              auVar243 = pshufhw(auVar35,auVar377,0x84);
              auVar35 = (auVar243 | auVar67 & auVar35) ^ auVar398;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar35 = auVar150 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar271._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar271._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar340._4_4_ = iVar115;
              auVar340._0_4_ = iVar115;
              auVar340._8_4_ = iVar178;
              auVar340._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar340,0xe8);
              auVar203._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar203._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar203._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar203._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar270._4_4_ = auVar203._4_4_;
              auVar270._0_4_ = auVar203._4_4_;
              auVar270._8_4_ = auVar203._12_4_;
              auVar270._12_4_ = auVar203._12_4_;
              auVar35 = pshuflw(auVar203,auVar270,0xe8);
              auVar271._0_4_ = auVar271._4_4_;
              auVar271._8_4_ = auVar271._12_4_;
              auVar243 = pshuflw(auVar63,auVar271,0xe8);
              auVar243 = (auVar243 | auVar35 & auVar63) ^ auVar398;
              auVar243 = packssdw(auVar243,auVar243);
              auVar35 = packsswb(auVar35 & auVar63,auVar243);
              if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar271 = auVar270 & auVar340 | auVar271;
              auVar63 = packssdw(auVar271,auVar271);
              auVar63 = packssdw(auVar63 ^ auVar398,auVar63 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar63);
              if ((auVar35._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar35 = auVar107 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar378._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar378._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar272._4_4_ = iVar115;
              auVar272._0_4_ = iVar115;
              auVar272._8_4_ = iVar178;
              auVar272._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar341._4_4_ = iVar115;
              auVar341._0_4_ = iVar115;
              auVar341._8_4_ = iVar178;
              auVar341._12_4_ = iVar178;
              auVar378._0_4_ = auVar378._4_4_;
              auVar378._8_4_ = auVar378._12_4_;
              auVar35 = auVar341 & auVar272 | auVar378;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar398,auVar35 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar35 = pshufhw(auVar35,auVar272,0x84);
              auVar67 = pshufhw(auVar272,auVar341,0x84);
              auVar63 = pshufhw(auVar35,auVar378,0x84);
              auVar35 = (auVar63 | auVar67 & auVar35) ^ auVar398;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar35 = auVar81 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar274._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar274._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar342._4_4_ = iVar115;
              auVar342._0_4_ = iVar115;
              auVar342._8_4_ = iVar178;
              auVar342._12_4_ = iVar178;
              auVar63 = pshuflw(auVar243,auVar342,0xe8);
              auVar204._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar204._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar204._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar204._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar273._4_4_ = auVar204._4_4_;
              auVar273._0_4_ = auVar204._4_4_;
              auVar273._8_4_ = auVar204._12_4_;
              auVar273._12_4_ = auVar204._12_4_;
              auVar35 = pshuflw(auVar204,auVar273,0xe8);
              auVar274._0_4_ = auVar274._4_4_;
              auVar274._8_4_ = auVar274._12_4_;
              auVar243 = pshuflw(auVar63,auVar274,0xe8);
              in_XMM11 = (auVar243 | auVar35 & auVar63) ^ auVar398;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM11);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar274 = auVar273 & auVar342 | auVar274;
              auVar63 = packssdw(auVar274,auVar274);
              auVar35 = packssdw(auVar35,auVar63 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar35 = auVar46 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar35._0_4_);
              auVar343._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar368 = -(uint)(iVar368 < auVar35._8_4_);
              auVar343._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar275._4_4_ = iVar113;
              auVar275._0_4_ = iVar113;
              auVar275._8_4_ = iVar368;
              auVar275._12_4_ = iVar368;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar27._4_4_ = iVar113;
              auVar27._0_4_ = iVar113;
              auVar27._8_4_ = iVar114;
              auVar27._12_4_ = iVar114;
              auVar343._0_4_ = auVar343._4_4_;
              auVar343._8_4_ = auVar343._12_4_;
              auVar35 = auVar27 & auVar275 | auVar343;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar398,auVar35 ^ auVar398);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar63 = pshufhw(auVar35,auVar275,0x84);
              auVar35 = pshufhw(auVar27,auVar27,0x84);
              auVar243 = pshufhw(auVar63,auVar343,0x84);
              in_XMM5 = (auVar243 | auVar35 & auVar63) ^ auVar398;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM5);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar414._8_8_;
              auVar414._0_8_ = auVar414._0_8_ + 0x10;
              auVar414._8_8_ = lVar9 + 0x10;
              lVar9 = auVar426._8_8_;
              auVar426._0_8_ = auVar426._0_8_ + 0x10;
              auVar426._8_8_ = lVar9 + 0x10;
              lVar9 = auVar438._8_8_;
              auVar438._0_8_ = auVar438._0_8_ + 0x10;
              auVar438._8_8_ = lVar9 + 0x10;
              lVar9 = auVar450._8_8_;
              auVar450._0_8_ = auVar450._0_8_ + 0x10;
              auVar450._8_8_ = lVar9 + 0x10;
              lVar9 = auVar150._8_8_;
              auVar150._0_8_ = auVar150._0_8_ + 0x10;
              auVar150._8_8_ = lVar9 + 0x10;
              lVar9 = auVar107._8_8_;
              auVar107._0_8_ = auVar107._0_8_ + 0x10;
              auVar107._8_8_ = lVar9 + 0x10;
              lVar9 = auVar81._8_8_;
              auVar81._0_8_ = auVar81._0_8_ + 0x10;
              auVar81._8_8_ = lVar9 + 0x10;
              lVar9 = auVar46._8_8_;
              auVar46._0_8_ = auVar46._0_8_ + 0x10;
              auVar46._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        uVar15 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            do {
              pRVar19[uVar8 * 2 + 1] = ((byte)(uVar15 >> 1) ^ 0x80) + cVar4 * '\x02';
              pRVar19[uVar8 * 2] = cVar4 * '\x05' + '@' + (char)uVar8;
              uVar8 = uVar8 + 1;
            } while (width >> 1 != uVar8);
          }
          uVar15 = uVar15 + 1;
          pRVar19 = pRVar19 + hor_stride;
        } while (uVar15 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_YUYV:
      if (height != 0) {
        uVar15 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            RVar12 = cVar4 * '\x05' + '@';
            uVar16 = uVar15;
            do {
              RVar14 = (RK_U8)uVar16;
              buf[uVar8 & 0xffffffff] = RVar14;
              iVar113 = (int)uVar8;
              buf[iVar113 + 2] = RVar14 + '\x01';
              buf[iVar113 + 1] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar4 * '\x02';
              buf[iVar113 + 3] = RVar12;
              uVar16 = (uint)(byte)(RVar14 + 2);
              RVar12 = RVar12 + '\x01';
              uVar8 = uVar8 + 4;
            } while ((ulong)(width >> 1) << 2 != uVar8);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar15 = (uint)(byte)((char)uVar15 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_YVYU:
      if (height != 0) {
        uVar15 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            RVar12 = cVar4 * '\x05' + '@';
            uVar16 = uVar15;
            do {
              RVar14 = (RK_U8)uVar16;
              buf[uVar8 & 0xffffffff] = RVar14;
              iVar113 = (int)uVar8;
              buf[iVar113 + 2] = RVar14 + '\x01';
              buf[iVar113 + 3] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar4 * '\x02';
              buf[iVar113 + 1] = RVar12;
              uVar16 = (uint)(byte)(RVar14 + 2);
              RVar12 = RVar12 + '\x01';
              uVar8 = uVar8 + 4;
            } while ((ulong)(width >> 1) << 2 != uVar8);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar15 = (uint)(byte)((char)uVar15 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_UYVY:
      if (height != 0) {
        uVar15 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            RVar12 = cVar4 * '\x05' + '@';
            uVar16 = uVar15;
            do {
              iVar113 = (int)uVar8;
              RVar14 = (RK_U8)uVar16;
              buf[iVar113 + 1] = RVar14;
              buf[iVar113 + 3] = RVar14 + '\x01';
              buf[uVar8 & 0xffffffff] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar4 * '\x02';
              buf[iVar113 + 2] = RVar12;
              uVar16 = (uint)(byte)(RVar14 + 2);
              RVar12 = RVar12 + '\x01';
              uVar8 = uVar8 + 4;
            } while ((ulong)(width >> 1) << 2 != uVar8);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar15 = (uint)(byte)((char)uVar15 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_VYUY:
      if (height != 0) {
        uVar15 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar8 = 0;
            RVar12 = cVar4 * '\x05' + '@';
            uVar16 = uVar15;
            do {
              iVar113 = (int)uVar8;
              RVar14 = (RK_U8)uVar16;
              buf[iVar113 + 1] = RVar14;
              buf[iVar113 + 3] = RVar14 + '\x01';
              buf[iVar113 + 2] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar4 * '\x02';
              buf[uVar8 & 0xffffffff] = RVar12;
              uVar16 = (uint)(byte)(RVar14 + 2);
              RVar12 = RVar12 + '\x01';
              uVar8 = uVar8 + 4;
            } while ((ulong)(width >> 1) << 2 != uVar8);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar15 = (uint)(byte)((char)uVar15 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV400:
      if (height != 0) {
        lVar9 = (ulong)width - 1;
        auVar34._8_4_ = (int)lVar9;
        auVar34._0_8_ = lVar9;
        auVar34._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar403._8_4_ = 0xffffffff;
        auVar403._0_8_ = 0xffffffffffffffff;
        auVar403._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar8 = 0;
            auVar51 = _DAT_00118210;
            auVar86 = _DAT_00118220;
            auVar112 = _DAT_00118230;
            auVar177 = _DAT_00118240;
            auVar419 = _DAT_00118280;
            auVar431 = _DAT_00118270;
            auVar443 = _DAT_00118260;
            auVar455 = _DAT_00118250;
            do {
              auVar35 = auVar34 ^ auVar41;
              auVar63 = auVar419 ^ auVar41;
              iVar113 = auVar35._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar35._4_4_;
              auVar309._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar35._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar35._12_4_;
              auVar309._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar360._4_4_ = iVar115;
              auVar360._0_4_ = iVar115;
              auVar360._8_4_ = iVar178;
              auVar360._12_4_ = iVar178;
              auVar35 = pshuflw(in_XMM5,auVar360,0xe8);
              auVar308._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar308._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar308._0_4_ = auVar308._4_4_;
              auVar308._8_4_ = auVar308._12_4_;
              auVar243 = pshuflw(in_XMM11,auVar308,0xe8);
              auVar309._0_4_ = auVar309._4_4_;
              auVar309._8_4_ = auVar309._12_4_;
              auVar63 = pshuflw(auVar35,auVar309,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar35) ^ auVar403;
              auVar63 = packssdw(auVar63,auVar63);
              cVar4 = (char)uVar15;
              cVar2 = (char)uVar8;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8] = cVar4 + cVar2;
              }
              auVar309 = auVar308 & auVar360 | auVar309;
              auVar63 = packssdw(auVar309,auVar309);
              auVar63 = packssdw(auVar63 ^ auVar403,auVar63 ^ auVar403);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                buf[uVar8 + 1] = cVar4 + cVar2 + '\x01';
              }
              auVar63 = auVar431 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar385._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar385._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar310._4_4_ = iVar115;
              auVar310._0_4_ = iVar115;
              auVar310._8_4_ = iVar178;
              auVar310._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar361._4_4_ = iVar115;
              auVar361._0_4_ = iVar115;
              auVar361._8_4_ = iVar178;
              auVar361._12_4_ = iVar178;
              auVar385._0_4_ = auVar385._4_4_;
              auVar385._8_4_ = auVar385._12_4_;
              auVar63 = auVar361 & auVar310 | auVar385;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar403,auVar63 ^ auVar403);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar8 + 2] = cVar4 + cVar2 + '\x02';
              }
              auVar63 = pshufhw(auVar63,auVar310,0x84);
              auVar68 = pshufhw(auVar310,auVar361,0x84);
              auVar67 = pshufhw(auVar63,auVar385,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar403;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar8 + 3] = cVar4 + cVar2 + '\x03';
              }
              auVar63 = auVar443 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar312._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar312._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar362._4_4_ = iVar115;
              auVar362._0_4_ = iVar115;
              auVar362._8_4_ = iVar178;
              auVar362._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243 & auVar35,auVar362,0xe8);
              auVar227._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar227._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar227._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar227._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar311._4_4_ = auVar227._4_4_;
              auVar311._0_4_ = auVar227._4_4_;
              auVar311._8_4_ = auVar227._12_4_;
              auVar311._12_4_ = auVar227._12_4_;
              auVar35 = pshuflw(auVar227,auVar311,0xe8);
              auVar312._0_4_ = auVar312._4_4_;
              auVar312._8_4_ = auVar312._12_4_;
              auVar63 = pshuflw(auVar243,auVar312,0xe8);
              auVar63 = (auVar63 | auVar35 & auVar243) ^ auVar403;
              auVar35 = packssdw(auVar35 & auVar243,auVar63);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 4] = cVar4 + cVar2 + '\x04';
              }
              auVar312 = auVar311 & auVar362 | auVar312;
              auVar243 = packssdw(auVar312,auVar312);
              auVar35 = packssdw(auVar35,auVar243 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._4_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 5] = cVar4 + cVar2 + '\x05';
              }
              auVar35 = auVar455 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar386._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar386._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar313._4_4_ = iVar115;
              auVar313._0_4_ = iVar115;
              auVar313._8_4_ = iVar178;
              auVar313._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar363._4_4_ = iVar115;
              auVar363._0_4_ = iVar115;
              auVar363._8_4_ = iVar178;
              auVar363._12_4_ = iVar178;
              auVar386._0_4_ = auVar386._4_4_;
              auVar386._8_4_ = auVar386._12_4_;
              auVar35 = auVar363 & auVar313 | auVar386;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar403,auVar35 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 6] = cVar4 + cVar2 + '\x06';
              }
              auVar35 = pshufhw(auVar35,auVar313,0x84);
              auVar67 = pshufhw(auVar313,auVar363,0x84);
              auVar243 = pshufhw(auVar35,auVar386,0x84);
              auVar35 = (auVar243 | auVar67 & auVar35) ^ auVar403;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._6_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 7] = cVar4 + cVar2 + '\a';
              }
              auVar35 = auVar177 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar315._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar315._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar364._4_4_ = iVar115;
              auVar364._0_4_ = iVar115;
              auVar364._8_4_ = iVar178;
              auVar364._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar364,0xe8);
              auVar228._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar228._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar228._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar228._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar314._4_4_ = auVar228._4_4_;
              auVar314._0_4_ = auVar228._4_4_;
              auVar314._8_4_ = auVar228._12_4_;
              auVar314._12_4_ = auVar228._12_4_;
              auVar35 = pshuflw(auVar228,auVar314,0xe8);
              auVar315._0_4_ = auVar315._4_4_;
              auVar315._8_4_ = auVar315._12_4_;
              auVar243 = pshuflw(auVar63,auVar315,0xe8);
              auVar243 = (auVar243 | auVar35 & auVar63) ^ auVar403;
              auVar243 = packssdw(auVar243,auVar243);
              auVar35 = packsswb(auVar35 & auVar63,auVar243);
              if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar8 + 8] = cVar4 + cVar2 + '\b';
              }
              auVar315 = auVar314 & auVar364 | auVar315;
              auVar63 = packssdw(auVar315,auVar315);
              auVar63 = packssdw(auVar63 ^ auVar403,auVar63 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar63);
              if ((auVar35._8_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 9] = cVar4 + cVar2 + '\t';
              }
              auVar35 = auVar112 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar387._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar387._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar316._4_4_ = iVar115;
              auVar316._0_4_ = iVar115;
              auVar316._8_4_ = iVar178;
              auVar316._12_4_ = iVar178;
              iVar115 = -(uint)(auVar35._4_4_ == iVar114);
              iVar178 = -(uint)(auVar35._12_4_ == iVar37);
              auVar365._4_4_ = iVar115;
              auVar365._0_4_ = iVar115;
              auVar365._8_4_ = iVar178;
              auVar365._12_4_ = iVar178;
              auVar387._0_4_ = auVar387._4_4_;
              auVar387._8_4_ = auVar387._12_4_;
              auVar35 = auVar365 & auVar316 | auVar387;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar403,auVar35 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar8 + 10] = cVar4 + cVar2 + '\n';
              }
              auVar35 = pshufhw(auVar35,auVar316,0x84);
              auVar67 = pshufhw(auVar316,auVar365,0x84);
              auVar63 = pshufhw(auVar35,auVar387,0x84);
              auVar35 = (auVar63 | auVar67 & auVar35) ^ auVar403;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._10_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xb] = cVar4 + cVar2 + '\v';
              }
              auVar35 = auVar86 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar35._0_4_);
              auVar318._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar178 = -(uint)(iVar368 < auVar35._8_4_);
              auVar318._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar366._4_4_ = iVar115;
              auVar366._0_4_ = iVar115;
              auVar366._8_4_ = iVar178;
              auVar366._12_4_ = iVar178;
              auVar63 = pshuflw(auVar243,auVar366,0xe8);
              auVar229._0_4_ = -(uint)(auVar35._0_4_ == iVar113);
              auVar229._4_4_ = -(uint)(auVar35._4_4_ == iVar114);
              auVar229._8_4_ = -(uint)(auVar35._8_4_ == iVar368);
              auVar229._12_4_ = -(uint)(auVar35._12_4_ == iVar37);
              auVar317._4_4_ = auVar229._4_4_;
              auVar317._0_4_ = auVar229._4_4_;
              auVar317._8_4_ = auVar229._12_4_;
              auVar317._12_4_ = auVar229._12_4_;
              auVar35 = pshuflw(auVar229,auVar317,0xe8);
              auVar318._0_4_ = auVar318._4_4_;
              auVar318._8_4_ = auVar318._12_4_;
              auVar243 = pshuflw(auVar63,auVar318,0xe8);
              in_XMM11 = (auVar243 | auVar35 & auVar63) ^ auVar403;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM11);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xc] = cVar4 + cVar2 + '\f';
              }
              auVar318 = auVar317 & auVar366 | auVar318;
              auVar63 = packssdw(auVar318,auVar318);
              auVar35 = packssdw(auVar35,auVar63 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._12_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xd] = cVar4 + cVar2 + '\r';
              }
              auVar35 = auVar51 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar35._0_4_);
              auVar367._4_4_ = -(uint)(iVar114 < auVar35._4_4_);
              iVar368 = -(uint)(iVar368 < auVar35._8_4_);
              auVar367._12_4_ = -(uint)(iVar37 < auVar35._12_4_);
              auVar319._4_4_ = iVar113;
              auVar319._0_4_ = iVar113;
              auVar319._8_4_ = iVar368;
              auVar319._12_4_ = iVar368;
              iVar113 = -(uint)(auVar35._4_4_ == iVar114);
              iVar114 = -(uint)(auVar35._12_4_ == iVar37);
              auVar36._4_4_ = iVar113;
              auVar36._0_4_ = iVar113;
              auVar36._8_4_ = iVar114;
              auVar36._12_4_ = iVar114;
              auVar367._0_4_ = auVar367._4_4_;
              auVar367._8_4_ = auVar367._12_4_;
              auVar35 = auVar36 & auVar319 | auVar367;
              auVar35 = packssdw(auVar35,auVar35);
              auVar35 = packssdw(auVar35 ^ auVar403,auVar35 ^ auVar403);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar8 + 0xe] = cVar4 + cVar2 + '\x0e';
              }
              auVar63 = pshufhw(auVar35,auVar319,0x84);
              auVar35 = pshufhw(auVar36,auVar36,0x84);
              auVar243 = pshufhw(auVar63,auVar367,0x84);
              in_XMM5 = (auVar243 | auVar35 & auVar63) ^ auVar403;
              auVar35 = packssdw(auVar35 & auVar63,in_XMM5);
              auVar35 = packsswb(auVar35,auVar35);
              if ((auVar35._14_2_ >> 8 & 1) != 0) {
                buf[uVar8 + 0xf] = cVar4 + cVar2 + '\x0f';
              }
              uVar8 = uVar8 + 0x10;
              lVar9 = auVar419._8_8_;
              auVar419._0_8_ = auVar419._0_8_ + 0x10;
              auVar419._8_8_ = lVar9 + 0x10;
              lVar9 = auVar431._8_8_;
              auVar431._0_8_ = auVar431._0_8_ + 0x10;
              auVar431._8_8_ = lVar9 + 0x10;
              lVar9 = auVar443._8_8_;
              auVar443._0_8_ = auVar443._0_8_ + 0x10;
              auVar443._8_8_ = lVar9 + 0x10;
              lVar9 = auVar455._8_8_;
              auVar455._0_8_ = auVar455._0_8_ + 0x10;
              auVar455._8_8_ = lVar9 + 0x10;
              lVar9 = auVar177._8_8_;
              auVar177._0_8_ = auVar177._0_8_ + 0x10;
              auVar177._8_8_ = lVar9 + 0x10;
              lVar9 = auVar112._8_8_;
              auVar112._0_8_ = auVar112._0_8_ + 0x10;
              auVar112._8_8_ = lVar9 + 0x10;
              lVar9 = auVar86._8_8_;
              auVar86._0_8_ = auVar86._0_8_ + 0x10;
              auVar86._8_8_ = lVar9 + 0x10;
              lVar9 = auVar51._8_8_;
              auVar51._0_8_ = auVar51._0_8_ + 0x10;
              auVar51._8_8_ = lVar9 + 0x10;
            } while (((ulong)width + 0xf & 0xfffffffffffffff0) != uVar8);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV444SP:
      if (height != 0) {
        uVar8 = (ulong)width;
        lVar9 = uVar8 - 1;
        auVar35._8_4_ = (int)lVar9;
        auVar35._0_8_ = lVar9;
        auVar35._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar15 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar395._8_4_ = 0xffffffff;
        auVar395._0_8_ = 0xffffffffffffffff;
        auVar395._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar11 = 0;
            auVar43 = _DAT_00118210;
            auVar78 = _DAT_00118220;
            auVar104 = _DAT_00118230;
            auVar125 = _DAT_00118240;
            auVar411 = _DAT_00118280;
            auVar423 = _DAT_00118270;
            auVar435 = _DAT_00118260;
            auVar447 = _DAT_00118250;
            do {
              auVar63 = auVar35 ^ auVar41;
              auVar243 = auVar411 ^ auVar41;
              iVar113 = auVar63._0_4_;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              iVar114 = auVar63._4_4_;
              auVar245._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar368 = auVar63._8_4_;
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              iVar37 = auVar63._12_4_;
              auVar245._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar328._4_4_ = iVar115;
              auVar328._0_4_ = iVar115;
              auVar328._8_4_ = iVar178;
              auVar328._12_4_ = iVar178;
              auVar63 = pshuflw(in_XMM5,auVar328,0xe8);
              auVar244._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar244._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar244._0_4_ = auVar244._4_4_;
              auVar244._8_4_ = auVar244._12_4_;
              auVar67 = pshuflw(in_XMM11,auVar244,0xe8);
              auVar245._0_4_ = auVar245._4_4_;
              auVar245._8_4_ = auVar245._12_4_;
              auVar243 = pshuflw(auVar63,auVar245,0xe8);
              auVar243 = (auVar243 | auVar67 & auVar63) ^ auVar395;
              auVar243 = packssdw(auVar243,auVar243);
              cVar2 = (char)uVar15;
              cVar3 = (char)uVar11;
              if ((auVar243 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar11] = cVar2 + cVar3;
              }
              auVar245 = auVar244 & auVar328 | auVar245;
              auVar243 = packssdw(auVar245,auVar245);
              auVar243 = packssdw(auVar243 ^ auVar395,auVar243 ^ auVar395);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 8 & 1) != 0) {
                buf[uVar11 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar243 = auVar423 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar373._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar373._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar246._4_4_ = iVar115;
              auVar246._0_4_ = iVar115;
              auVar246._8_4_ = iVar178;
              auVar246._12_4_ = iVar178;
              iVar115 = -(uint)(auVar243._4_4_ == iVar114);
              iVar178 = -(uint)(auVar243._12_4_ == iVar37);
              auVar329._4_4_ = iVar115;
              auVar329._0_4_ = iVar115;
              auVar329._8_4_ = iVar178;
              auVar329._12_4_ = iVar178;
              auVar373._0_4_ = auVar373._4_4_;
              auVar373._8_4_ = auVar373._12_4_;
              auVar243 = auVar329 & auVar246 | auVar373;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packssdw(auVar243 ^ auVar395,auVar243 ^ auVar395);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 0x10 & 1) != 0) {
                buf[uVar11 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar243 = pshufhw(auVar243,auVar246,0x84);
              auVar97 = pshufhw(auVar246,auVar329,0x84);
              auVar68 = pshufhw(auVar243,auVar373,0x84);
              auVar243 = (auVar68 | auVar97 & auVar243) ^ auVar395;
              auVar243 = packssdw(auVar243,auVar243);
              auVar243 = packsswb(auVar243,auVar243);
              if ((auVar243._0_4_ >> 0x18 & 1) != 0) {
                buf[uVar11 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar243 = auVar435 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar243._0_4_);
              auVar248._4_4_ = -(uint)(iVar114 < auVar243._4_4_);
              iVar178 = -(uint)(iVar368 < auVar243._8_4_);
              auVar248._12_4_ = -(uint)(iVar37 < auVar243._12_4_);
              auVar330._4_4_ = iVar115;
              auVar330._0_4_ = iVar115;
              auVar330._8_4_ = iVar178;
              auVar330._12_4_ = iVar178;
              auVar67 = pshuflw(auVar67 & auVar63,auVar330,0xe8);
              auVar183._0_4_ = -(uint)(auVar243._0_4_ == iVar113);
              auVar183._4_4_ = -(uint)(auVar243._4_4_ == iVar114);
              auVar183._8_4_ = -(uint)(auVar243._8_4_ == iVar368);
              auVar183._12_4_ = -(uint)(auVar243._12_4_ == iVar37);
              auVar247._4_4_ = auVar183._4_4_;
              auVar247._0_4_ = auVar183._4_4_;
              auVar247._8_4_ = auVar183._12_4_;
              auVar247._12_4_ = auVar183._12_4_;
              auVar63 = pshuflw(auVar183,auVar247,0xe8);
              auVar248._0_4_ = auVar248._4_4_;
              auVar248._8_4_ = auVar248._12_4_;
              auVar243 = pshuflw(auVar67,auVar248,0xe8);
              auVar243 = (auVar243 | auVar63 & auVar67) ^ auVar395;
              auVar63 = packssdw(auVar63 & auVar67,auVar243);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar11 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar248 = auVar247 & auVar330 | auVar248;
              auVar67 = packssdw(auVar248,auVar248);
              auVar63 = packssdw(auVar63,auVar67 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._4_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar63 = auVar447 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar374._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar374._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar249._4_4_ = iVar115;
              auVar249._0_4_ = iVar115;
              auVar249._8_4_ = iVar178;
              auVar249._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar331._4_4_ = iVar115;
              auVar331._0_4_ = iVar115;
              auVar331._8_4_ = iVar178;
              auVar331._12_4_ = iVar178;
              auVar374._0_4_ = auVar374._4_4_;
              auVar374._8_4_ = auVar374._12_4_;
              auVar63 = auVar331 & auVar249 | auVar374;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar395,auVar63 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar11 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar63 = pshufhw(auVar63,auVar249,0x84);
              auVar68 = pshufhw(auVar249,auVar331,0x84);
              auVar67 = pshufhw(auVar63,auVar374,0x84);
              auVar63 = (auVar67 | auVar68 & auVar63) ^ auVar395;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._6_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar63 = auVar125 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar251._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar251._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar332._4_4_ = iVar115;
              auVar332._0_4_ = iVar115;
              auVar332._8_4_ = iVar178;
              auVar332._12_4_ = iVar178;
              auVar243 = pshuflw(auVar243,auVar332,0xe8);
              auVar184._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar184._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar184._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar184._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar250._4_4_ = auVar184._4_4_;
              auVar250._0_4_ = auVar184._4_4_;
              auVar250._8_4_ = auVar184._12_4_;
              auVar250._12_4_ = auVar184._12_4_;
              auVar63 = pshuflw(auVar184,auVar250,0xe8);
              auVar251._0_4_ = auVar251._4_4_;
              auVar251._8_4_ = auVar251._12_4_;
              auVar67 = pshuflw(auVar243,auVar251,0xe8);
              auVar67 = (auVar67 | auVar63 & auVar243) ^ auVar395;
              auVar67 = packssdw(auVar67,auVar67);
              auVar63 = packsswb(auVar63 & auVar243,auVar67);
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                buf[uVar11 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar251 = auVar250 & auVar332 | auVar251;
              auVar243 = packssdw(auVar251,auVar251);
              auVar243 = packssdw(auVar243 ^ auVar395,auVar243 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar243);
              if ((auVar63._8_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar63 = auVar104 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar375._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar375._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar252._4_4_ = iVar115;
              auVar252._0_4_ = iVar115;
              auVar252._8_4_ = iVar178;
              auVar252._12_4_ = iVar178;
              iVar115 = -(uint)(auVar63._4_4_ == iVar114);
              iVar178 = -(uint)(auVar63._12_4_ == iVar37);
              auVar333._4_4_ = iVar115;
              auVar333._0_4_ = iVar115;
              auVar333._8_4_ = iVar178;
              auVar333._12_4_ = iVar178;
              auVar375._0_4_ = auVar375._4_4_;
              auVar375._8_4_ = auVar375._12_4_;
              auVar63 = auVar333 & auVar252 | auVar375;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar395,auVar63 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                buf[uVar11 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar63 = pshufhw(auVar63,auVar252,0x84);
              auVar68 = pshufhw(auVar252,auVar333,0x84);
              auVar243 = pshufhw(auVar63,auVar375,0x84);
              auVar63 = (auVar243 | auVar68 & auVar63) ^ auVar395;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._10_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar63 = auVar78 ^ auVar41;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar254._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar254._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar334._4_4_ = iVar115;
              auVar334._0_4_ = iVar115;
              auVar334._8_4_ = iVar178;
              auVar334._12_4_ = iVar178;
              auVar243 = pshuflw(auVar67,auVar334,0xe8);
              auVar185._0_4_ = -(uint)(auVar63._0_4_ == iVar113);
              auVar185._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar185._8_4_ = -(uint)(auVar63._8_4_ == iVar368);
              auVar185._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar253._4_4_ = auVar185._4_4_;
              auVar253._0_4_ = auVar185._4_4_;
              auVar253._8_4_ = auVar185._12_4_;
              auVar253._12_4_ = auVar185._12_4_;
              auVar63 = pshuflw(auVar185,auVar253,0xe8);
              auVar254._0_4_ = auVar254._4_4_;
              auVar254._8_4_ = auVar254._12_4_;
              auVar67 = pshuflw(auVar243,auVar254,0xe8);
              in_XMM11 = (auVar67 | auVar63 & auVar243) ^ auVar395;
              auVar63 = packssdw(auVar63 & auVar243,in_XMM11);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                buf[uVar11 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar254 = auVar253 & auVar334 | auVar254;
              auVar243 = packssdw(auVar254,auVar254);
              auVar63 = packssdw(auVar63,auVar243 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._12_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar63 = auVar43 ^ auVar41;
              iVar113 = -(uint)(iVar113 < auVar63._0_4_);
              auVar335._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = -(uint)(iVar368 < auVar63._8_4_);
              auVar335._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar255._4_4_ = iVar113;
              auVar255._0_4_ = iVar113;
              auVar255._8_4_ = iVar368;
              auVar255._12_4_ = iVar368;
              iVar113 = -(uint)(auVar63._4_4_ == iVar114);
              iVar114 = -(uint)(auVar63._12_4_ == iVar37);
              auVar23._4_4_ = iVar113;
              auVar23._0_4_ = iVar113;
              auVar23._8_4_ = iVar114;
              auVar23._12_4_ = iVar114;
              auVar335._0_4_ = auVar335._4_4_;
              auVar335._8_4_ = auVar335._12_4_;
              auVar63 = auVar23 & auVar255 | auVar335;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar395,auVar63 ^ auVar395);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                buf[uVar11 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar243 = pshufhw(auVar63,auVar255,0x84);
              auVar63 = pshufhw(auVar23,auVar23,0x84);
              auVar67 = pshufhw(auVar243,auVar335,0x84);
              in_XMM5 = (auVar67 | auVar63 & auVar243) ^ auVar395;
              auVar63 = packssdw(auVar63 & auVar243,in_XMM5);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._14_2_ >> 8 & 1) != 0) {
                buf[uVar11 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar11 = uVar11 + 0x10;
              lVar9 = auVar411._8_8_;
              auVar411._0_8_ = auVar411._0_8_ + 0x10;
              auVar411._8_8_ = lVar9 + 0x10;
              lVar9 = auVar423._8_8_;
              auVar423._0_8_ = auVar423._0_8_ + 0x10;
              auVar423._8_8_ = lVar9 + 0x10;
              lVar9 = auVar435._8_8_;
              auVar435._0_8_ = auVar435._0_8_ + 0x10;
              auVar435._8_8_ = lVar9 + 0x10;
              lVar9 = auVar447._8_8_;
              auVar447._0_8_ = auVar447._0_8_ + 0x10;
              auVar447._8_8_ = lVar9 + 0x10;
              lVar9 = auVar125._8_8_;
              auVar125._0_8_ = auVar125._0_8_ + 0x10;
              auVar125._8_8_ = lVar9 + 0x10;
              lVar9 = auVar104._8_8_;
              auVar104._0_8_ = auVar104._0_8_ + 0x10;
              auVar104._8_8_ = lVar9 + 0x10;
              lVar9 = auVar78._8_8_;
              auVar78._0_8_ = auVar78._0_8_ + 0x10;
              auVar78._8_8_ = lVar9 + 0x10;
              lVar9 = auVar43._8_8_;
              auVar43._0_8_ = auVar43._0_8_ + 0x10;
              auVar43._8_8_ = lVar9 + 0x10;
            } while ((uVar8 + 0xf & 0xfffffffffffffff0) != uVar11);
          }
          RVar13 = RVar13 + 1;
          buf = buf + hor_stride;
          uVar15 = uVar15 + 1;
        } while (RVar13 != height);
        uVar15 = 0;
        do {
          if (width != 0) {
            uVar11 = 0;
            RVar12 = cVar4 * '\x05' + '@';
            do {
              pRVar19[uVar11 & 0xffffffff] = ((byte)(uVar15 >> 1) ^ 0x80) + cVar4 * '\x02';
              pRVar19[(int)uVar11 + 1] = RVar12;
              RVar12 = RVar12 + '\x01';
              uVar11 = uVar11 + 2;
            } while (uVar8 * 2 != uVar11);
          }
          uVar15 = uVar15 + 1;
          pRVar19 = pRVar19 + hor_stride * 2;
        } while (uVar15 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV444P:
      if (height != 0) {
        local_50 = (ulong)width;
        uVar8 = local_50 + 0xf;
        lVar9 = local_50 - 1;
        local_48._8_4_ = (int)lVar9;
        local_48._0_8_ = lVar9;
        local_48._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar17 = frame_count * 3 & 0xff;
        RVar13 = 0;
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        pRVar10 = buf;
        do {
          if (width != 0) {
            uVar11 = 0;
            auVar63 = _DAT_00118210;
            auVar243 = auVar35;
            auVar67 = _DAT_00118270;
            auVar68 = _DAT_00118260;
            auVar97 = _DAT_00118250;
            auVar421 = _DAT_00118240;
            auVar433 = _DAT_00118230;
            auVar445 = _DAT_00118220;
            do {
              auVar39 = local_48 ^ _DAT_00118290;
              auVar53 = auVar243 ^ _DAT_00118290;
              iVar113 = auVar39._0_4_;
              iVar115 = -(uint)(iVar113 < auVar53._0_4_);
              iVar114 = auVar39._4_4_;
              auVar54._4_4_ = -(uint)(iVar114 < auVar53._4_4_);
              iVar368 = auVar39._8_4_;
              iVar178 = -(uint)(iVar368 < auVar53._8_4_);
              iVar37 = auVar39._12_4_;
              auVar54._12_4_ = -(uint)(iVar37 < auVar53._12_4_);
              auVar89._4_4_ = iVar115;
              auVar89._0_4_ = iVar115;
              auVar89._8_4_ = iVar178;
              auVar89._12_4_ = iVar178;
              auVar182 = pshuflw(in_XMM5,auVar89,0xe8);
              auVar39._4_4_ = -(uint)(auVar53._4_4_ == iVar114);
              auVar39._12_4_ = -(uint)(auVar53._12_4_ == iVar37);
              auVar39._0_4_ = auVar39._4_4_;
              auVar39._8_4_ = auVar39._12_4_;
              auVar242 = pshuflw(in_XMM6,auVar39,0xe8);
              auVar54._0_4_ = auVar54._4_4_;
              auVar54._8_4_ = auVar54._12_4_;
              auVar53 = pshuflw(auVar182,auVar54,0xe8);
              auVar53 = (auVar53 | auVar242 & auVar182) ^ auVar41;
              auVar53 = packssdw(auVar53,auVar53);
              cVar2 = (char)uVar17;
              cVar3 = (char)uVar11;
              if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar10[uVar11] = cVar2 + cVar3;
              }
              auVar54 = auVar39 & auVar89 | auVar54;
              auVar39 = packssdw(auVar54,auVar54);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39._0_4_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 1] = cVar2 + cVar3 + '\x01';
              }
              auVar39 = auVar67 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar39._0_4_);
              auVar117._4_4_ = -(uint)(iVar114 < auVar39._4_4_);
              iVar178 = -(uint)(iVar368 < auVar39._8_4_);
              auVar117._12_4_ = -(uint)(iVar37 < auVar39._12_4_);
              auVar53._4_4_ = iVar115;
              auVar53._0_4_ = iVar115;
              auVar53._8_4_ = iVar178;
              auVar53._12_4_ = iVar178;
              auVar88._4_4_ = -(uint)(auVar39._4_4_ == iVar114);
              auVar88._12_4_ = -(uint)(auVar39._12_4_ == iVar37);
              auVar88._0_4_ = auVar88._4_4_;
              auVar88._8_4_ = auVar88._12_4_;
              auVar117._0_4_ = auVar117._4_4_;
              auVar117._8_4_ = auVar117._12_4_;
              auVar39 = auVar88 & auVar53 | auVar117;
              auVar39 = packssdw(auVar39,auVar39);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
                pRVar10[uVar11 + 2] = cVar2 + cVar3 + '\x02';
              }
              auVar53 = pshufhw(auVar53,auVar53,0x84);
              auVar89 = pshufhw(auVar88,auVar88,0x84);
              auVar54 = pshufhw(auVar53,auVar117,0x84);
              auVar53 = (auVar54 | auVar89 & auVar53) ^ auVar41;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._0_4_ >> 0x18 & 1) != 0) {
                pRVar10[uVar11 + 3] = cVar2 + cVar3 + '\x03';
              }
              auVar53 = auVar68 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar53._0_4_);
              auVar56._4_4_ = -(uint)(iVar114 < auVar53._4_4_);
              iVar178 = -(uint)(iVar368 < auVar53._8_4_);
              auVar56._12_4_ = -(uint)(iVar37 < auVar53._12_4_);
              auVar90._4_4_ = iVar115;
              auVar90._0_4_ = iVar115;
              auVar90._8_4_ = iVar178;
              auVar90._12_4_ = iVar178;
              auVar39 = pshuflw(auVar39,auVar90,0xe8);
              auVar55._4_4_ = -(uint)(auVar53._4_4_ == iVar114);
              auVar55._12_4_ = -(uint)(auVar53._12_4_ == iVar37);
              auVar55._0_4_ = auVar55._4_4_;
              auVar55._8_4_ = auVar55._12_4_;
              auVar54 = pshuflw(auVar242 & auVar182,auVar55,0xe8);
              auVar56._0_4_ = auVar56._4_4_;
              auVar56._8_4_ = auVar56._12_4_;
              auVar53 = pshuflw(auVar39,auVar56,0xe8);
              auVar53 = (auVar53 | auVar54 & auVar39) ^ auVar41;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 4] = cVar2 + cVar3 + '\x04';
              }
              auVar56 = auVar55 & auVar90 | auVar56;
              auVar53 = packssdw(auVar56,auVar56);
              auVar53 = packssdw(auVar53 ^ auVar41,auVar53 ^ auVar41);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53._4_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 5] = cVar2 + cVar3 + '\x05';
              }
              auVar53 = auVar97 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar53._0_4_);
              auVar118._4_4_ = -(uint)(iVar114 < auVar53._4_4_);
              iVar178 = -(uint)(iVar368 < auVar53._8_4_);
              auVar118._12_4_ = -(uint)(iVar37 < auVar53._12_4_);
              auVar182._4_4_ = iVar115;
              auVar182._0_4_ = iVar115;
              auVar182._8_4_ = iVar178;
              auVar182._12_4_ = iVar178;
              auVar242._4_4_ = -(uint)(auVar53._4_4_ == iVar114);
              auVar242._12_4_ = -(uint)(auVar53._12_4_ == iVar37);
              auVar242._0_4_ = auVar242._4_4_;
              auVar242._8_4_ = auVar242._12_4_;
              auVar118._0_4_ = auVar118._4_4_;
              auVar118._8_4_ = auVar118._12_4_;
              auVar53 = auVar242 & auVar182 | auVar118;
              auVar53 = packssdw(auVar53,auVar53);
              auVar53 = packssdw(auVar53 ^ auVar41,auVar53 ^ auVar41);
              auVar53 = packsswb(auVar53,auVar53);
              if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 6] = cVar2 + cVar3 + '\x06';
              }
              auVar89 = pshufhw(auVar182,auVar182,0x84);
              auVar242 = pshufhw(auVar242,auVar242,0x84);
              auVar182 = pshufhw(auVar89,auVar118,0x84);
              auVar89 = (auVar182 | auVar242 & auVar89) ^ auVar41;
              auVar89 = packssdw(auVar89,auVar89);
              auVar89 = packsswb(auVar89,auVar89);
              if ((auVar89._6_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 7] = cVar2 + cVar3 + '\a';
              }
              auVar89 = auVar421 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar89._0_4_);
              auVar58._4_4_ = -(uint)(iVar114 < auVar89._4_4_);
              iVar178 = -(uint)(iVar368 < auVar89._8_4_);
              auVar58._12_4_ = -(uint)(iVar37 < auVar89._12_4_);
              auVar91._4_4_ = iVar115;
              auVar91._0_4_ = iVar115;
              auVar91._8_4_ = iVar178;
              auVar91._12_4_ = iVar178;
              auVar53 = pshuflw(auVar53,auVar91,0xe8);
              auVar57._4_4_ = -(uint)(auVar89._4_4_ == iVar114);
              auVar57._12_4_ = -(uint)(auVar89._12_4_ == iVar37);
              auVar57._0_4_ = auVar57._4_4_;
              auVar57._8_4_ = auVar57._12_4_;
              auVar54 = pshuflw(auVar54 & auVar39,auVar57,0xe8);
              auVar58._0_4_ = auVar58._4_4_;
              auVar58._8_4_ = auVar58._12_4_;
              auVar39 = pshuflw(auVar53,auVar58,0xe8);
              auVar39 = (auVar39 | auVar54 & auVar53) ^ auVar41;
              auVar39 = packssdw(auVar39,auVar39);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 8] = cVar2 + cVar3 + '\b';
              }
              auVar58 = auVar57 & auVar91 | auVar58;
              auVar39 = packssdw(auVar58,auVar58);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39._8_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 9] = cVar2 + cVar3 + '\t';
              }
              auVar39 = auVar433 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar39._0_4_);
              auVar119._4_4_ = -(uint)(iVar114 < auVar39._4_4_);
              iVar178 = -(uint)(iVar368 < auVar39._8_4_);
              auVar119._12_4_ = -(uint)(iVar37 < auVar39._12_4_);
              auVar59._4_4_ = iVar115;
              auVar59._0_4_ = iVar115;
              auVar59._8_4_ = iVar178;
              auVar59._12_4_ = iVar178;
              auVar92._4_4_ = -(uint)(auVar39._4_4_ == iVar114);
              auVar92._12_4_ = -(uint)(auVar39._12_4_ == iVar37);
              auVar92._0_4_ = auVar92._4_4_;
              auVar92._8_4_ = auVar92._12_4_;
              auVar119._0_4_ = auVar119._4_4_;
              auVar119._8_4_ = auVar119._12_4_;
              auVar39 = auVar92 & auVar59 | auVar119;
              auVar39 = packssdw(auVar39,auVar39);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 10] = cVar2 + cVar3 + '\n';
              }
              auVar89 = pshufhw(auVar59,auVar59,0x84);
              auVar242 = pshufhw(auVar92,auVar92,0x84);
              auVar182 = pshufhw(auVar89,auVar119,0x84);
              auVar89 = (auVar182 | auVar242 & auVar89) ^ auVar41;
              auVar89 = packssdw(auVar89,auVar89);
              auVar89 = packsswb(auVar89,auVar89);
              if ((auVar89._10_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 0xb] = cVar2 + cVar3 + '\v';
              }
              auVar89 = auVar445 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar89._0_4_);
              auVar61._4_4_ = -(uint)(iVar114 < auVar89._4_4_);
              iVar178 = -(uint)(iVar368 < auVar89._8_4_);
              auVar61._12_4_ = -(uint)(iVar37 < auVar89._12_4_);
              auVar93._4_4_ = iVar115;
              auVar93._0_4_ = iVar115;
              auVar93._8_4_ = iVar178;
              auVar93._12_4_ = iVar178;
              auVar39 = pshuflw(auVar39,auVar93,0xe8);
              auVar60._4_4_ = -(uint)(auVar89._4_4_ == iVar114);
              auVar60._12_4_ = -(uint)(auVar89._12_4_ == iVar37);
              auVar60._0_4_ = auVar60._4_4_;
              auVar60._8_4_ = auVar60._12_4_;
              auVar53 = pshuflw(auVar54 & auVar53,auVar60,0xe8);
              in_XMM6 = auVar53 & auVar39;
              auVar61._0_4_ = auVar61._4_4_;
              auVar61._8_4_ = auVar61._12_4_;
              auVar39 = pshuflw(auVar39,auVar61,0xe8);
              auVar39 = (auVar39 | in_XMM6) ^ auVar41;
              auVar39 = packssdw(auVar39,auVar39);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 0xc] = cVar2 + cVar3 + '\f';
              }
              auVar61 = auVar60 & auVar93 | auVar61;
              auVar39 = packssdw(auVar61,auVar61);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39._12_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 0xd] = cVar2 + cVar3 + '\r';
              }
              auVar39 = auVar63 ^ _DAT_00118290;
              auVar120._0_4_ = -(uint)(iVar113 < auVar39._0_4_);
              auVar120._4_4_ = -(uint)(iVar114 < auVar39._4_4_);
              auVar120._8_4_ = -(uint)(iVar368 < auVar39._8_4_);
              auVar120._12_4_ = -(uint)(iVar37 < auVar39._12_4_);
              auVar62._4_4_ = auVar120._0_4_;
              auVar62._0_4_ = auVar120._0_4_;
              auVar62._8_4_ = auVar120._8_4_;
              auVar62._12_4_ = auVar120._8_4_;
              iVar113 = -(uint)(auVar39._4_4_ == iVar114);
              iVar114 = -(uint)(auVar39._12_4_ == iVar37);
              auVar40._4_4_ = iVar113;
              auVar40._0_4_ = iVar113;
              auVar40._8_4_ = iVar114;
              auVar40._12_4_ = iVar114;
              auVar94._4_4_ = auVar120._4_4_;
              auVar94._0_4_ = auVar120._4_4_;
              auVar94._8_4_ = auVar120._12_4_;
              auVar94._12_4_ = auVar120._12_4_;
              in_XMM5 = auVar40 & auVar62 | auVar94;
              auVar39 = packssdw(auVar120,in_XMM5);
              auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar10[uVar11 + 0xe] = cVar2 + cVar3 + '\x0e';
              }
              auVar53 = pshufhw(auVar62,auVar62,0x84);
              auVar39 = pshufhw(auVar40,auVar40,0x84);
              auVar54 = pshufhw(auVar53,auVar94,0x84);
              auVar39 = packssdw(auVar39 & auVar53,(auVar54 | auVar39 & auVar53) ^ auVar41);
              auVar39 = packsswb(auVar39,auVar39);
              if ((auVar39._14_2_ >> 8 & 1) != 0) {
                pRVar10[uVar11 + 0xf] = cVar2 + cVar3 + '\x0f';
              }
              uVar11 = uVar11 + 0x10;
              lVar9 = auVar243._8_8_;
              auVar243._0_8_ = auVar243._0_8_ + 0x10;
              auVar243._8_8_ = lVar9 + 0x10;
              lVar9 = auVar67._8_8_;
              auVar67._0_8_ = auVar67._0_8_ + 0x10;
              auVar67._8_8_ = lVar9 + 0x10;
              lVar9 = auVar68._8_8_;
              auVar68._0_8_ = auVar68._0_8_ + 0x10;
              auVar68._8_8_ = lVar9 + 0x10;
              lVar9 = auVar97._8_8_;
              auVar97._0_8_ = auVar97._0_8_ + 0x10;
              auVar97._8_8_ = lVar9 + 0x10;
              lVar9 = auVar421._8_8_;
              auVar421._0_8_ = auVar421._0_8_ + 0x10;
              auVar421._8_8_ = lVar9 + 0x10;
              lVar9 = auVar433._8_8_;
              auVar433._0_8_ = auVar433._0_8_ + 0x10;
              auVar433._8_8_ = lVar9 + 0x10;
              lVar9 = auVar445._8_8_;
              auVar445._0_8_ = auVar445._0_8_ + 0x10;
              auVar445._8_8_ = lVar9 + 0x10;
              lVar9 = auVar63._8_8_;
              auVar63._0_8_ = auVar63._0_8_ + 0x10;
              auVar63._8_8_ = lVar9 + 0x10;
            } while ((uVar8 & 0xfffffffffffffff0) != uVar11);
          }
          RVar13 = RVar13 + 1;
          pRVar10 = pRVar10 + hor_stride;
          uVar17 = uVar17 + 1;
        } while (RVar13 != height);
        uVar17 = 0;
        do {
          if (width != 0) {
            memset(pRVar19,(uVar17 >> 1 ^ 0x80) + frame_count * 2,local_50);
          }
          auVar35 = _DAT_00118280;
          uVar17 = uVar17 + 1;
          pRVar19 = pRVar19 + hor_stride;
        } while (height != uVar17);
        pRVar19 = buf + uVar15 * 2;
        cVar4 = cVar4 * '\x05';
        RVar13 = 0;
        auVar372._8_4_ = 0xffffffff;
        auVar372._0_8_ = 0xffffffffffffffff;
        auVar372._12_4_ = 0xffffffff;
        do {
          if (width != 0) {
            uVar11 = 0;
            auVar22 = _DAT_00118210;
            auVar388 = auVar35;
            auVar394 = _DAT_00118270;
            auVar404 = _DAT_00118260;
            auVar410 = _DAT_00118250;
            auVar422 = _DAT_00118240;
            auVar434 = _DAT_00118230;
            auVar446 = _DAT_00118220;
            do {
              auVar41 = local_48 ^ _DAT_00118290;
              auVar63 = auVar388 ^ _DAT_00118290;
              iVar113 = auVar41._0_4_;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              iVar114 = auVar41._4_4_;
              auVar65._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar368 = auVar41._8_4_;
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              iVar37 = auVar41._12_4_;
              auVar65._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar95._4_4_ = iVar115;
              auVar95._0_4_ = iVar115;
              auVar95._8_4_ = iVar178;
              auVar95._12_4_ = iVar178;
              auVar41 = pshuflw(in_XMM5,auVar95,0xe8);
              auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar64._0_4_ = auVar64._4_4_;
              auVar64._8_4_ = auVar64._12_4_;
              auVar243 = pshuflw(in_XMM6,auVar64,0xe8);
              auVar65._0_4_ = auVar65._4_4_;
              auVar65._8_4_ = auVar65._12_4_;
              auVar63 = pshuflw(auVar41,auVar65,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar41) ^ auVar372;
              auVar63 = packssdw(auVar63,auVar63);
              cVar2 = (char)uVar11;
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar19[uVar11] = cVar4 + cVar2 + '@';
              }
              auVar65 = auVar64 & auVar95 | auVar65;
              auVar63 = packssdw(auVar65,auVar65);
              auVar63 = packssdw(auVar63 ^ auVar372,auVar63 ^ auVar372);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 1] = cVar4 + cVar2 + 'A';
              }
              auVar63 = auVar394 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar121._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar121._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar66._4_4_ = iVar115;
              auVar66._0_4_ = iVar115;
              auVar66._8_4_ = iVar178;
              auVar66._12_4_ = iVar178;
              auVar96._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar96._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar121._0_4_ = auVar121._4_4_;
              auVar121._8_4_ = auVar121._12_4_;
              auVar63 = auVar96 & auVar66 | auVar121;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar372,auVar63 ^ auVar372);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                pRVar19[uVar11 + 2] = cVar4 + cVar2 + 'B';
              }
              auVar67 = pshufhw(auVar66,auVar66,0x84);
              auVar97 = pshufhw(auVar96,auVar96,0x84);
              auVar68 = pshufhw(auVar67,auVar121,0x84);
              auVar67 = (auVar68 | auVar97 & auVar67) ^ auVar372;
              auVar67 = packssdw(auVar67,auVar67);
              auVar67 = packsswb(auVar67,auVar67);
              if ((auVar67._0_4_ >> 0x18 & 1) != 0) {
                pRVar19[uVar11 + 3] = cVar4 + cVar2 + 'C';
              }
              auVar67 = auVar404 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar67._0_4_);
              auVar70._4_4_ = -(uint)(iVar114 < auVar67._4_4_);
              iVar178 = -(uint)(iVar368 < auVar67._8_4_);
              auVar70._12_4_ = -(uint)(iVar37 < auVar67._12_4_);
              auVar98._4_4_ = iVar115;
              auVar98._0_4_ = iVar115;
              auVar98._8_4_ = iVar178;
              auVar98._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar98,0xe8);
              auVar69._4_4_ = -(uint)(auVar67._4_4_ == iVar114);
              auVar69._12_4_ = -(uint)(auVar67._12_4_ == iVar37);
              auVar69._0_4_ = auVar69._4_4_;
              auVar69._8_4_ = auVar69._12_4_;
              auVar243 = pshuflw(auVar243 & auVar41,auVar69,0xe8);
              auVar70._0_4_ = auVar70._4_4_;
              auVar70._8_4_ = auVar70._12_4_;
              auVar41 = pshuflw(auVar63,auVar70,0xe8);
              auVar41 = (auVar41 | auVar243 & auVar63) ^ auVar372;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 4] = cVar4 + cVar2 + 'D';
              }
              auVar70 = auVar69 & auVar98 | auVar70;
              auVar41 = packssdw(auVar70,auVar70);
              auVar41 = packssdw(auVar41 ^ auVar372,auVar41 ^ auVar372);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._4_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 5] = cVar4 + cVar2 + 'E';
              }
              auVar41 = auVar410 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar41._0_4_);
              auVar122._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              iVar178 = -(uint)(iVar368 < auVar41._8_4_);
              auVar122._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar71._4_4_ = iVar115;
              auVar71._0_4_ = iVar115;
              auVar71._8_4_ = iVar178;
              auVar71._12_4_ = iVar178;
              auVar99._4_4_ = -(uint)(auVar41._4_4_ == iVar114);
              auVar99._12_4_ = -(uint)(auVar41._12_4_ == iVar37);
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar122._0_4_ = auVar122._4_4_;
              auVar122._8_4_ = auVar122._12_4_;
              auVar41 = auVar99 & auVar71 | auVar122;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packssdw(auVar41 ^ auVar372,auVar41 ^ auVar372);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 6] = cVar4 + cVar2 + 'F';
              }
              auVar67 = pshufhw(auVar71,auVar71,0x84);
              auVar97 = pshufhw(auVar99,auVar99,0x84);
              auVar68 = pshufhw(auVar67,auVar122,0x84);
              auVar67 = (auVar68 | auVar97 & auVar67) ^ auVar372;
              auVar67 = packssdw(auVar67,auVar67);
              auVar67 = packsswb(auVar67,auVar67);
              if ((auVar67._6_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 7] = cVar4 + cVar2 + 'G';
              }
              auVar67 = auVar422 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar67._0_4_);
              auVar73._4_4_ = -(uint)(iVar114 < auVar67._4_4_);
              iVar178 = -(uint)(iVar368 < auVar67._8_4_);
              auVar73._12_4_ = -(uint)(iVar37 < auVar67._12_4_);
              auVar100._4_4_ = iVar115;
              auVar100._0_4_ = iVar115;
              auVar100._8_4_ = iVar178;
              auVar100._12_4_ = iVar178;
              auVar41 = pshuflw(auVar41,auVar100,0xe8);
              auVar72._4_4_ = -(uint)(auVar67._4_4_ == iVar114);
              auVar72._12_4_ = -(uint)(auVar67._12_4_ == iVar37);
              auVar72._0_4_ = auVar72._4_4_;
              auVar72._8_4_ = auVar72._12_4_;
              auVar243 = pshuflw(auVar243 & auVar63,auVar72,0xe8);
              auVar73._0_4_ = auVar73._4_4_;
              auVar73._8_4_ = auVar73._12_4_;
              auVar63 = pshuflw(auVar41,auVar73,0xe8);
              auVar63 = (auVar63 | auVar243 & auVar41) ^ auVar372;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 8] = cVar4 + cVar2 + 'H';
              }
              auVar73 = auVar72 & auVar100 | auVar73;
              auVar63 = packssdw(auVar73,auVar73);
              auVar63 = packssdw(auVar63 ^ auVar372,auVar63 ^ auVar372);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63._8_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 9] = cVar4 + cVar2 + 'I';
              }
              auVar63 = auVar434 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar63._0_4_);
              auVar123._4_4_ = -(uint)(iVar114 < auVar63._4_4_);
              iVar178 = -(uint)(iVar368 < auVar63._8_4_);
              auVar123._12_4_ = -(uint)(iVar37 < auVar63._12_4_);
              auVar74._4_4_ = iVar115;
              auVar74._0_4_ = iVar115;
              auVar74._8_4_ = iVar178;
              auVar74._12_4_ = iVar178;
              auVar101._4_4_ = -(uint)(auVar63._4_4_ == iVar114);
              auVar101._12_4_ = -(uint)(auVar63._12_4_ == iVar37);
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              auVar123._0_4_ = auVar123._4_4_;
              auVar123._8_4_ = auVar123._12_4_;
              auVar63 = auVar101 & auVar74 | auVar123;
              auVar63 = packssdw(auVar63,auVar63);
              auVar63 = packssdw(auVar63 ^ auVar372,auVar63 ^ auVar372);
              auVar63 = packsswb(auVar63,auVar63);
              if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 10] = cVar4 + cVar2 + 'J';
              }
              auVar67 = pshufhw(auVar74,auVar74,0x84);
              auVar97 = pshufhw(auVar101,auVar101,0x84);
              auVar68 = pshufhw(auVar67,auVar123,0x84);
              auVar67 = (auVar68 | auVar97 & auVar67) ^ auVar372;
              auVar67 = packssdw(auVar67,auVar67);
              auVar67 = packsswb(auVar67,auVar67);
              if ((auVar67._10_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 0xb] = cVar4 + cVar2 + 'K';
              }
              auVar67 = auVar446 ^ _DAT_00118290;
              iVar115 = -(uint)(iVar113 < auVar67._0_4_);
              auVar76._4_4_ = -(uint)(iVar114 < auVar67._4_4_);
              iVar178 = -(uint)(iVar368 < auVar67._8_4_);
              auVar76._12_4_ = -(uint)(iVar37 < auVar67._12_4_);
              auVar102._4_4_ = iVar115;
              auVar102._0_4_ = iVar115;
              auVar102._8_4_ = iVar178;
              auVar102._12_4_ = iVar178;
              auVar63 = pshuflw(auVar63,auVar102,0xe8);
              auVar75._4_4_ = -(uint)(auVar67._4_4_ == iVar114);
              auVar75._12_4_ = -(uint)(auVar67._12_4_ == iVar37);
              auVar75._0_4_ = auVar75._4_4_;
              auVar75._8_4_ = auVar75._12_4_;
              auVar41 = pshuflw(auVar243 & auVar41,auVar75,0xe8);
              in_XMM6 = auVar41 & auVar63;
              auVar76._0_4_ = auVar76._4_4_;
              auVar76._8_4_ = auVar76._12_4_;
              auVar41 = pshuflw(auVar63,auVar76,0xe8);
              auVar41 = (auVar41 | in_XMM6) ^ auVar372;
              auVar41 = packssdw(auVar41,auVar41);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 0xc] = cVar4 + cVar2 + 'L';
              }
              auVar76 = auVar75 & auVar102 | auVar76;
              auVar41 = packssdw(auVar76,auVar76);
              auVar41 = packssdw(auVar41 ^ auVar372,auVar41 ^ auVar372);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._12_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 0xd] = cVar4 + cVar2 + 'M';
              }
              auVar41 = auVar22 ^ _DAT_00118290;
              auVar124._0_4_ = -(uint)(iVar113 < auVar41._0_4_);
              auVar124._4_4_ = -(uint)(iVar114 < auVar41._4_4_);
              auVar124._8_4_ = -(uint)(iVar368 < auVar41._8_4_);
              auVar124._12_4_ = -(uint)(iVar37 < auVar41._12_4_);
              auVar77._4_4_ = auVar124._0_4_;
              auVar77._0_4_ = auVar124._0_4_;
              auVar77._8_4_ = auVar124._8_4_;
              auVar77._12_4_ = auVar124._8_4_;
              iVar113 = -(uint)(auVar41._4_4_ == iVar114);
              iVar114 = -(uint)(auVar41._12_4_ == iVar37);
              auVar42._4_4_ = iVar113;
              auVar42._0_4_ = iVar113;
              auVar42._8_4_ = iVar114;
              auVar42._12_4_ = iVar114;
              auVar103._4_4_ = auVar124._4_4_;
              auVar103._0_4_ = auVar124._4_4_;
              auVar103._8_4_ = auVar124._12_4_;
              auVar103._12_4_ = auVar124._12_4_;
              in_XMM5 = auVar42 & auVar77 | auVar103;
              auVar41 = packssdw(auVar124,in_XMM5);
              auVar41 = packssdw(auVar41 ^ auVar372,auVar41 ^ auVar372);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pRVar19[uVar11 + 0xe] = cVar4 + cVar2 + 'N';
              }
              auVar63 = pshufhw(auVar77,auVar77,0x84);
              auVar41 = pshufhw(auVar42,auVar42,0x84);
              auVar243 = pshufhw(auVar63,auVar103,0x84);
              auVar41 = packssdw(auVar41 & auVar63,(auVar243 | auVar41 & auVar63) ^ auVar372);
              auVar41 = packsswb(auVar41,auVar41);
              if ((auVar41._14_2_ >> 8 & 1) != 0) {
                pRVar19[uVar11 + 0xf] = cVar4 + cVar2 + 'O';
              }
              uVar11 = uVar11 + 0x10;
              lVar9 = auVar388._8_8_;
              auVar388._0_8_ = auVar388._0_8_ + 0x10;
              auVar388._8_8_ = lVar9 + 0x10;
              lVar9 = auVar394._8_8_;
              auVar394._0_8_ = auVar394._0_8_ + 0x10;
              auVar394._8_8_ = lVar9 + 0x10;
              lVar9 = auVar404._8_8_;
              auVar404._0_8_ = auVar404._0_8_ + 0x10;
              auVar404._8_8_ = lVar9 + 0x10;
              lVar9 = auVar410._8_8_;
              auVar410._0_8_ = auVar410._0_8_ + 0x10;
              auVar410._8_8_ = lVar9 + 0x10;
              lVar9 = auVar422._8_8_;
              auVar422._0_8_ = auVar422._0_8_ + 0x10;
              auVar422._8_8_ = lVar9 + 0x10;
              lVar9 = auVar434._8_8_;
              auVar434._0_8_ = auVar434._0_8_ + 0x10;
              auVar434._8_8_ = lVar9 + 0x10;
              lVar9 = auVar446._8_8_;
              auVar446._0_8_ = auVar446._0_8_ + 0x10;
              auVar446._8_8_ = lVar9 + 0x10;
              lVar9 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 0x10;
              auVar22._8_8_ = lVar9 + 0x10;
            } while ((uVar8 & 0x1fffffff0) != uVar11);
          }
          RVar13 = RVar13 + 1;
          pRVar19 = pRVar19 + hor_stride;
        } while (RVar13 != height);
        return MPP_OK;
      }
    }
LAB_001131c9:
    MVar7 = MPP_OK;
  }
  else {
switchD_0010e474_caseD_1:
    _mpp_log_l(2,"utils","filling function do not support type %d\n","fill_image",fmt);
    MVar7 = MPP_NOK;
  }
  return MVar7;
}

Assistant:

MPP_RET fill_image(RK_U8 *buf, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt,
                   RK_U32 frame_count)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_c = buf + hor_stride * ver_stride;
    RK_U32 x, y, i;
    static RK_S32 is_pixel_stride = 0;
    static RK_S32 not_8_pixel = 0;

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        fill_MPP_FMT_YUV420SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV422SP : {
        fill_MPP_FMT_YUV422SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV420P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 4;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV420SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 2;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YUYV : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 3] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YVYU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 3] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_UYVY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 2] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_VYUY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 2] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV400 : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
    } break;
    case MPP_FMT_YUV444SP : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride * 2) {
            for (x = 0; x < width; x++) {
                p[x * 2 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV444P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }
        p = buf + hor_stride * ver_stride * 2;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 2;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "16bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 16);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 4;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "32bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 32);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 3;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "24bit RGB")) {
            hor_stride = MPP_ALIGN_GEN(hor_stride, 24);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    default : {
        mpp_err_f("filling function do not support type %d\n", fmt);
        ret = MPP_NOK;
    } break;
    }
    return ret;
}